

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O2

bool embree::sse2::CurveNiIntersectorK<4,4>::
     occluded_n<embree::sse2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,4>,embree::sse2::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined1 (*pauVar1) [12];
  Primitive *pPVar2;
  float *pfVar3;
  undefined8 *puVar4;
  Primitive PVar5;
  undefined4 uVar6;
  Geometry *pGVar7;
  void *pvVar8;
  __int_type_conflict _Var9;
  long lVar10;
  ulong uVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined8 uVar24;
  undefined8 uVar25;
  undefined6 uVar26;
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined1 auVar29 [12];
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  bool bVar44;
  bool bVar45;
  byte bVar46;
  int iVar47;
  long lVar49;
  RTCFilterFunctionN p_Var50;
  RTCRayN *pRVar51;
  LinearSpace3fa *pLVar52;
  undefined4 uVar53;
  ulong uVar54;
  bool bVar55;
  ulong uVar56;
  bool bVar57;
  uint uVar58;
  uint uVar59;
  int iVar60;
  uint uVar61;
  uint uVar62;
  float fVar63;
  float fVar92;
  float fVar94;
  vfloat_impl<4> p00;
  undefined1 auVar64 [16];
  undefined2 uVar91;
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar69 [16];
  undefined1 auVar72 [16];
  undefined1 auVar75 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar93;
  float fVar95;
  float fVar96;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  short sVar97;
  float fVar98;
  float fVar131;
  float fVar132;
  undefined1 auVar99 [16];
  undefined1 auVar102 [16];
  undefined1 auVar105 [16];
  undefined1 auVar108 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float t1;
  float fVar133;
  float fVar143;
  float fVar144;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  float fVar145;
  float fVar146;
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar147;
  float fVar152;
  float fVar153;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  float fVar154;
  float fVar167;
  float fVar168;
  vfloat4 v;
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  float fVar169;
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar170;
  float fVar171;
  float fVar184;
  float fVar186;
  vfloat4 a;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar185;
  float fVar187;
  float fVar188;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  float fVar189;
  float fVar190;
  float fVar206;
  float fVar208;
  undefined1 auVar191 [16];
  undefined1 auVar194 [16];
  undefined1 auVar197 [16];
  undefined1 auVar200 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar207;
  float fVar209;
  float fVar210;
  undefined1 auVar205 [16];
  float fVar211;
  float fVar220;
  float fVar222;
  undefined1 auVar212 [16];
  float fVar221;
  float fVar223;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  float fVar224;
  float fVar234;
  float fVar235;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  float fVar236;
  float fVar246;
  float fVar248;
  undefined1 auVar238 [16];
  float fVar237;
  float fVar247;
  float fVar249;
  float fVar250;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  float fVar251;
  float fVar252;
  float fVar253;
  float fVar259;
  float fVar260;
  float fVar261;
  float fVar262;
  float fVar263;
  float fVar264;
  float fVar265;
  float fVar266;
  float fVar267;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  float fVar268;
  float fVar269;
  float fVar270;
  float fVar275;
  float fVar280;
  vfloat4 a_1;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar297;
  float fVar301;
  undefined1 auVar290 [16];
  float fVar305;
  undefined1 auVar293 [16];
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar306;
  float fVar307;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar316;
  float fVar318;
  float fVar320;
  undefined1 auVar312 [16];
  float fVar317;
  float fVar319;
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  float fVar321;
  float fVar322;
  float fVar323;
  float fVar327;
  float fVar328;
  float fVar329;
  float fVar330;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  float fVar334;
  float fVar337;
  float fVar338;
  undefined1 auVar335 [16];
  float fVar339;
  undefined1 auVar336 [16];
  undefined1 local_548 [8];
  float fStack_540;
  float fStack_53c;
  undefined1 local_528 [8];
  float fStack_520;
  float fStack_51c;
  BBox1f local_518;
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  undefined8 local_4b8;
  undefined1 local_408 [16];
  undefined1 (*local_3f8) [16];
  ulong local_3f0;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [16];
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a8 [16];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  BBox1f cv_stack [4];
  ulong uVar48;
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 uVar130;
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  
  PVar5 = prim[1];
  uVar54 = (ulong)(byte)PVar5;
  pPVar2 = prim + uVar54 * 0x19 + 6;
  fVar153 = *(float *)(pPVar2 + 0xc);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x30);
  fVar154 = (*(float *)(ray + k * 4) - *(float *)pPVar2) * fVar153;
  fVar167 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar2 + 4)) * fVar153;
  fVar168 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar2 + 8)) * fVar153;
  fVar147 = *(float *)(ray + k * 4 + 0x40) * fVar153;
  fVar152 = *(float *)(ray + k * 4 + 0x50) * fVar153;
  fVar153 = *(float *)(ray + k * 4 + 0x60) * fVar153;
  uVar6 = *(undefined4 *)(prim + uVar54 * 4 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar101._8_4_ = 0;
  auVar101._0_8_ = uVar48;
  auVar101._12_2_ = uVar91;
  auVar101._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar100._12_4_ = auVar101._12_4_;
  auVar100._8_2_ = 0;
  auVar100._0_8_ = uVar48;
  auVar100._10_2_ = uVar91;
  auVar99._10_6_ = auVar100._10_6_;
  auVar99._8_2_ = uVar91;
  auVar99._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar27._4_8_ = auVar99._8_8_;
  auVar27._2_2_ = uVar91;
  auVar27._0_2_ = uVar91;
  fVar133 = (float)((int)sVar97 >> 8);
  fVar143 = (float)(auVar27._0_4_ >> 0x18);
  fVar144 = (float)(auVar99._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 5 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar104._8_4_ = 0;
  auVar104._0_8_ = uVar48;
  auVar104._12_2_ = uVar91;
  auVar104._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar103._12_4_ = auVar104._12_4_;
  auVar103._8_2_ = 0;
  auVar103._0_8_ = uVar48;
  auVar103._10_2_ = uVar91;
  auVar102._10_6_ = auVar103._10_6_;
  auVar102._8_2_ = uVar91;
  auVar102._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar28._4_8_ = auVar102._8_8_;
  auVar28._2_2_ = uVar91;
  auVar28._0_2_ = uVar91;
  fVar170 = (float)((int)sVar97 >> 8);
  fVar184 = (float)(auVar28._0_4_ >> 0x18);
  fVar186 = (float)(auVar102._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 6 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar107._8_4_ = 0;
  auVar107._0_8_ = uVar48;
  auVar107._12_2_ = uVar91;
  auVar107._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar106._12_4_ = auVar107._12_4_;
  auVar106._8_2_ = 0;
  auVar106._0_8_ = uVar48;
  auVar106._10_2_ = uVar91;
  auVar105._10_6_ = auVar106._10_6_;
  auVar105._8_2_ = uVar91;
  auVar105._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar29._4_8_ = auVar105._8_8_;
  auVar29._2_2_ = uVar91;
  auVar29._0_2_ = uVar91;
  fVar224 = (float)((int)sVar97 >> 8);
  fVar234 = (float)(auVar29._0_4_ >> 0x18);
  fVar235 = (float)(auVar105._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0xb + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar110._8_4_ = 0;
  auVar110._0_8_ = uVar48;
  auVar110._12_2_ = uVar91;
  auVar110._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar109._12_4_ = auVar110._12_4_;
  auVar109._8_2_ = 0;
  auVar109._0_8_ = uVar48;
  auVar109._10_2_ = uVar91;
  auVar108._10_6_ = auVar109._10_6_;
  auVar108._8_2_ = uVar91;
  auVar108._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar30._4_8_ = auVar108._8_8_;
  auVar30._2_2_ = uVar91;
  auVar30._0_2_ = uVar91;
  fVar63 = (float)((int)sVar97 >> 8);
  fVar92 = (float)(auVar30._0_4_ >> 0x18);
  fVar94 = (float)(auVar108._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0xc + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar193._8_4_ = 0;
  auVar193._0_8_ = uVar48;
  auVar193._12_2_ = uVar91;
  auVar193._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar192._12_4_ = auVar193._12_4_;
  auVar192._8_2_ = 0;
  auVar192._0_8_ = uVar48;
  auVar192._10_2_ = uVar91;
  auVar191._10_6_ = auVar192._10_6_;
  auVar191._8_2_ = uVar91;
  auVar191._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar31._4_8_ = auVar191._8_8_;
  auVar31._2_2_ = uVar91;
  auVar31._0_2_ = uVar91;
  fVar211 = (float)((int)sVar97 >> 8);
  fVar220 = (float)(auVar31._0_4_ >> 0x18);
  fVar222 = (float)(auVar191._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0xd + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar196._8_4_ = 0;
  auVar196._0_8_ = uVar48;
  auVar196._12_2_ = uVar91;
  auVar196._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar195._12_4_ = auVar196._12_4_;
  auVar195._8_2_ = 0;
  auVar195._0_8_ = uVar48;
  auVar195._10_2_ = uVar91;
  auVar194._10_6_ = auVar195._10_6_;
  auVar194._8_2_ = uVar91;
  auVar194._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar32._4_8_ = auVar194._8_8_;
  auVar32._2_2_ = uVar91;
  auVar32._0_2_ = uVar91;
  fVar251 = (float)((int)sVar97 >> 8);
  fVar259 = (float)(auVar32._0_4_ >> 0x18);
  fVar262 = (float)(auVar194._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0x12 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar199._8_4_ = 0;
  auVar199._0_8_ = uVar48;
  auVar199._12_2_ = uVar91;
  auVar199._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar198._12_4_ = auVar199._12_4_;
  auVar198._8_2_ = 0;
  auVar198._0_8_ = uVar48;
  auVar198._10_2_ = uVar91;
  auVar197._10_6_ = auVar198._10_6_;
  auVar197._8_2_ = uVar91;
  auVar197._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar33._4_8_ = auVar197._8_8_;
  auVar33._2_2_ = uVar91;
  auVar33._0_2_ = uVar91;
  fVar236 = (float)((int)sVar97 >> 8);
  fVar246 = (float)(auVar33._0_4_ >> 0x18);
  fVar248 = (float)(auVar197._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0x13 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar202._8_4_ = 0;
  auVar202._0_8_ = uVar48;
  auVar202._12_2_ = uVar91;
  auVar202._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar201._12_4_ = auVar202._12_4_;
  auVar201._8_2_ = 0;
  auVar201._0_8_ = uVar48;
  auVar201._10_2_ = uVar91;
  auVar200._10_6_ = auVar201._10_6_;
  auVar200._8_2_ = uVar91;
  auVar200._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar34._4_8_ = auVar200._8_8_;
  auVar34._2_2_ = uVar91;
  auVar34._0_2_ = uVar91;
  fVar268 = (float)((int)sVar97 >> 8);
  fVar275 = (float)(auVar34._0_4_ >> 0x18);
  fVar280 = (float)(auVar200._8_4_ >> 0x18);
  uVar6 = *(undefined4 *)(prim + uVar54 * 0x14 + 6);
  uVar130 = (undefined1)((uint)uVar6 >> 0x18);
  uVar91 = CONCAT11(uVar130,uVar130);
  uVar130 = (undefined1)((uint)uVar6 >> 0x10);
  uVar24 = CONCAT35(CONCAT21(uVar91,uVar130),CONCAT14(uVar130,uVar6));
  uVar130 = (undefined1)((uint)uVar6 >> 8);
  uVar26 = CONCAT51(CONCAT41((int)((ulong)uVar24 >> 0x20),uVar130),uVar130);
  sVar97 = CONCAT11((char)uVar6,(char)uVar6);
  uVar48 = CONCAT62(uVar26,sVar97);
  auVar292._8_4_ = 0;
  auVar292._0_8_ = uVar48;
  auVar292._12_2_ = uVar91;
  auVar292._14_2_ = uVar91;
  uVar91 = (undefined2)((ulong)uVar24 >> 0x20);
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._8_2_ = 0;
  auVar291._0_8_ = uVar48;
  auVar291._10_2_ = uVar91;
  auVar290._10_6_ = auVar291._10_6_;
  auVar290._8_2_ = uVar91;
  auVar290._0_8_ = uVar48;
  uVar91 = (undefined2)uVar26;
  auVar35._4_8_ = auVar290._8_8_;
  auVar35._2_2_ = uVar91;
  auVar35._0_2_ = uVar91;
  fVar98 = (float)((int)sVar97 >> 8);
  fVar131 = (float)(auVar35._0_4_ >> 0x18);
  fVar132 = (float)(auVar290._8_4_ >> 0x18);
  fVar308 = fVar147 * fVar133 + fVar152 * fVar170 + fVar153 * fVar224;
  fVar316 = fVar147 * fVar143 + fVar152 * fVar184 + fVar153 * fVar234;
  fVar318 = fVar147 * fVar144 + fVar152 * fVar186 + fVar153 * fVar235;
  fVar320 = fVar147 * (float)(auVar100._12_4_ >> 0x18) +
            fVar152 * (float)(auVar103._12_4_ >> 0x18) + fVar153 * (float)(auVar106._12_4_ >> 0x18);
  fVar287 = fVar147 * fVar63 + fVar152 * fVar211 + fVar153 * fVar251;
  fVar297 = fVar147 * fVar92 + fVar152 * fVar220 + fVar153 * fVar259;
  fVar301 = fVar147 * fVar94 + fVar152 * fVar222 + fVar153 * fVar262;
  fVar305 = fVar147 * (float)(auVar109._12_4_ >> 0x18) +
            fVar152 * (float)(auVar192._12_4_ >> 0x18) + fVar153 * (float)(auVar195._12_4_ >> 0x18);
  fVar189 = fVar147 * fVar236 + fVar152 * fVar268 + fVar153 * fVar98;
  fVar206 = fVar147 * fVar246 + fVar152 * fVar275 + fVar153 * fVar131;
  fVar208 = fVar147 * fVar248 + fVar152 * fVar280 + fVar153 * fVar132;
  fVar147 = fVar147 * (float)(auVar198._12_4_ >> 0x18) +
            fVar152 * (float)(auVar201._12_4_ >> 0x18) + fVar153 * (float)(auVar291._12_4_ >> 0x18);
  fVar170 = fVar133 * fVar154 + fVar170 * fVar167 + fVar224 * fVar168;
  fVar184 = fVar143 * fVar154 + fVar184 * fVar167 + fVar234 * fVar168;
  fVar186 = fVar144 * fVar154 + fVar186 * fVar167 + fVar235 * fVar168;
  fVar224 = (float)(auVar100._12_4_ >> 0x18) * fVar154 +
            (float)(auVar103._12_4_ >> 0x18) * fVar167 + (float)(auVar106._12_4_ >> 0x18) * fVar168;
  fVar234 = fVar63 * fVar154 + fVar211 * fVar167 + fVar251 * fVar168;
  fVar235 = fVar92 * fVar154 + fVar220 * fVar167 + fVar259 * fVar168;
  fVar251 = fVar94 * fVar154 + fVar222 * fVar167 + fVar262 * fVar168;
  fVar259 = (float)(auVar109._12_4_ >> 0x18) * fVar154 +
            (float)(auVar192._12_4_ >> 0x18) * fVar167 + (float)(auVar195._12_4_ >> 0x18) * fVar168;
  fVar211 = fVar154 * fVar236 + fVar167 * fVar268 + fVar168 * fVar98;
  fVar220 = fVar154 * fVar246 + fVar167 * fVar275 + fVar168 * fVar131;
  fVar222 = fVar154 * fVar248 + fVar167 * fVar280 + fVar168 * fVar132;
  fVar154 = fVar154 * (float)(auVar198._12_4_ >> 0x18) +
            fVar167 * (float)(auVar201._12_4_ >> 0x18) + fVar168 * (float)(auVar291._12_4_ >> 0x18);
  fVar153 = (float)DAT_01f4bd50;
  fVar63 = DAT_01f4bd50._4_4_;
  fVar92 = DAT_01f4bd50._8_4_;
  fVar94 = DAT_01f4bd50._12_4_;
  uVar58 = -(uint)(fVar153 <= ABS(fVar308));
  uVar59 = -(uint)(fVar63 <= ABS(fVar316));
  uVar61 = -(uint)(fVar92 <= ABS(fVar318));
  uVar62 = -(uint)(fVar94 <= ABS(fVar320));
  auVar312._0_4_ = (uint)fVar308 & uVar58;
  auVar312._4_4_ = (uint)fVar316 & uVar59;
  auVar312._8_4_ = (uint)fVar318 & uVar61;
  auVar312._12_4_ = (uint)fVar320 & uVar62;
  auVar155._0_4_ = ~uVar58 & (uint)fVar153;
  auVar155._4_4_ = ~uVar59 & (uint)fVar63;
  auVar155._8_4_ = ~uVar61 & (uint)fVar92;
  auVar155._12_4_ = ~uVar62 & (uint)fVar94;
  auVar155 = auVar155 | auVar312;
  uVar58 = -(uint)(fVar153 <= ABS(fVar287));
  uVar59 = -(uint)(fVar63 <= ABS(fVar297));
  uVar61 = -(uint)(fVar92 <= ABS(fVar301));
  uVar62 = -(uint)(fVar94 <= ABS(fVar305));
  auVar293._0_4_ = (uint)fVar287 & uVar58;
  auVar293._4_4_ = (uint)fVar297 & uVar59;
  auVar293._8_4_ = (uint)fVar301 & uVar61;
  auVar293._12_4_ = (uint)fVar305 & uVar62;
  auVar172._0_4_ = ~uVar58 & (uint)fVar153;
  auVar172._4_4_ = ~uVar59 & (uint)fVar63;
  auVar172._8_4_ = ~uVar61 & (uint)fVar92;
  auVar172._12_4_ = ~uVar62 & (uint)fVar94;
  auVar172 = auVar172 | auVar293;
  uVar58 = -(uint)(fVar153 <= ABS(fVar189));
  uVar59 = -(uint)(fVar63 <= ABS(fVar206));
  uVar61 = -(uint)(fVar92 <= ABS(fVar208));
  uVar62 = -(uint)(fVar94 <= ABS(fVar147));
  auVar203._0_4_ = (uint)fVar189 & uVar58;
  auVar203._4_4_ = (uint)fVar206 & uVar59;
  auVar203._8_4_ = (uint)fVar208 & uVar61;
  auVar203._12_4_ = (uint)fVar147 & uVar62;
  auVar238._0_4_ = ~uVar58 & (uint)fVar153;
  auVar238._4_4_ = ~uVar59 & (uint)fVar63;
  auVar238._8_4_ = ~uVar61 & (uint)fVar92;
  auVar238._12_4_ = ~uVar62 & (uint)fVar94;
  auVar238 = auVar238 | auVar203;
  auVar64 = rcpps(_DAT_01f4bd50,auVar155);
  fVar153 = auVar64._0_4_;
  fVar94 = auVar64._4_4_;
  fVar132 = auVar64._8_4_;
  fVar144 = auVar64._12_4_;
  fVar153 = (1.0 - auVar155._0_4_ * fVar153) * fVar153 + fVar153;
  fVar94 = (1.0 - auVar155._4_4_ * fVar94) * fVar94 + fVar94;
  fVar132 = (1.0 - auVar155._8_4_ * fVar132) * fVar132 + fVar132;
  fVar144 = (1.0 - auVar155._12_4_ * fVar144) * fVar144 + fVar144;
  auVar64 = rcpps(auVar64,auVar172);
  fVar63 = auVar64._0_4_;
  fVar98 = auVar64._4_4_;
  fVar133 = auVar64._8_4_;
  fVar147 = auVar64._12_4_;
  fVar63 = (1.0 - auVar172._0_4_ * fVar63) * fVar63 + fVar63;
  fVar98 = (1.0 - auVar172._4_4_ * fVar98) * fVar98 + fVar98;
  fVar133 = (1.0 - auVar172._8_4_ * fVar133) * fVar133 + fVar133;
  fVar147 = (1.0 - auVar172._12_4_ * fVar147) * fVar147 + fVar147;
  auVar64 = rcpps(auVar64,auVar238);
  fVar92 = auVar64._0_4_;
  fVar131 = auVar64._4_4_;
  fVar143 = auVar64._8_4_;
  fVar152 = auVar64._12_4_;
  fVar92 = (1.0 - auVar238._0_4_ * fVar92) * fVar92 + fVar92;
  fVar131 = (1.0 - auVar238._4_4_ * fVar131) * fVar131 + fVar131;
  fVar143 = (1.0 - auVar238._8_4_ * fVar143) * fVar143 + fVar143;
  fVar152 = (1.0 - auVar238._12_4_ * fVar152) * fVar152 + fVar152;
  uVar48 = *(ulong *)(prim + uVar54 * 7 + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar48;
  auVar115._12_2_ = uVar91;
  auVar115._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar174._12_4_ = auVar115._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar48;
  auVar174._10_2_ = uVar91;
  auVar64._10_6_ = auVar174._10_6_;
  auVar64._8_2_ = uVar91;
  auVar64._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar36._4_8_ = auVar64._8_8_;
  auVar36._2_2_ = uVar91;
  auVar36._0_2_ = uVar91;
  auVar156._0_8_ =
       CONCAT44(((float)(auVar36._0_4_ >> 0x10) - fVar184) * fVar94,
                ((float)(int)(short)uVar48 - fVar170) * fVar153);
  auVar156._8_4_ = ((float)(auVar64._8_4_ >> 0x10) - fVar186) * fVar132;
  auVar156._12_4_ = ((float)(auVar174._12_4_ >> 0x10) - fVar224) * fVar144;
  uVar48 = *(ulong *)(prim + uVar54 * 9 + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar136._8_4_ = 0;
  auVar136._0_8_ = uVar48;
  auVar136._12_2_ = uVar91;
  auVar136._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar240._12_4_ = auVar136._12_4_;
  auVar240._8_2_ = 0;
  auVar240._0_8_ = uVar48;
  auVar240._10_2_ = uVar91;
  auVar65._10_6_ = auVar240._10_6_;
  auVar65._8_2_ = uVar91;
  auVar65._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar37._4_8_ = auVar65._8_8_;
  auVar37._2_2_ = uVar91;
  auVar37._0_2_ = uVar91;
  auVar204._0_4_ = ((float)(int)(short)uVar48 - fVar170) * fVar153;
  auVar204._4_4_ = ((float)(auVar37._0_4_ >> 0x10) - fVar184) * fVar94;
  auVar204._8_4_ = ((float)(auVar65._8_4_ >> 0x10) - fVar186) * fVar132;
  auVar204._12_4_ = ((float)(auVar240._12_4_ >> 0x10) - fVar224) * fVar144;
  uVar48 = *(ulong *)(prim + uVar54 * 0xe + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar68._8_4_ = 0;
  auVar68._0_8_ = uVar48;
  auVar68._12_2_ = uVar91;
  auVar68._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar67._12_4_ = auVar68._12_4_;
  auVar67._8_2_ = 0;
  auVar67._0_8_ = uVar48;
  auVar67._10_2_ = uVar91;
  auVar66._10_6_ = auVar67._10_6_;
  auVar66._8_2_ = uVar91;
  auVar66._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar38._4_8_ = auVar66._8_8_;
  auVar38._2_2_ = uVar91;
  auVar38._0_2_ = uVar91;
  auVar134._0_8_ =
       CONCAT44(((float)(auVar38._0_4_ >> 0x10) - fVar235) * fVar98,
                ((float)(int)(short)uVar48 - fVar234) * fVar63);
  auVar134._8_4_ = ((float)(auVar66._8_4_ >> 0x10) - fVar251) * fVar133;
  auVar134._12_4_ = ((float)(auVar67._12_4_ >> 0x10) - fVar259) * fVar147;
  uVar48 = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar71._8_4_ = 0;
  auVar71._0_8_ = uVar48;
  auVar71._12_2_ = uVar91;
  auVar71._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar70._12_4_ = auVar71._12_4_;
  auVar70._8_2_ = 0;
  auVar70._0_8_ = uVar48;
  auVar70._10_2_ = uVar91;
  auVar69._10_6_ = auVar70._10_6_;
  auVar69._8_2_ = uVar91;
  auVar69._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar39._4_8_ = auVar69._8_8_;
  auVar39._2_2_ = uVar91;
  auVar39._0_2_ = uVar91;
  auVar225._0_4_ = ((float)(int)(short)uVar48 - fVar234) * fVar63;
  auVar225._4_4_ = ((float)(auVar39._0_4_ >> 0x10) - fVar235) * fVar98;
  auVar225._8_4_ = ((float)(auVar69._8_4_ >> 0x10) - fVar251) * fVar133;
  auVar225._12_4_ = ((float)(auVar70._12_4_ >> 0x10) - fVar259) * fVar147;
  uVar48 = *(ulong *)(prim + uVar54 * 0x15 + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar74._8_4_ = 0;
  auVar74._0_8_ = uVar48;
  auVar74._12_2_ = uVar91;
  auVar74._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar73._12_4_ = auVar74._12_4_;
  auVar73._8_2_ = 0;
  auVar73._0_8_ = uVar48;
  auVar73._10_2_ = uVar91;
  auVar72._10_6_ = auVar73._10_6_;
  auVar72._8_2_ = uVar91;
  auVar72._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar40._4_8_ = auVar72._8_8_;
  auVar40._2_2_ = uVar91;
  auVar40._0_2_ = uVar91;
  auVar111._0_8_ =
       CONCAT44(((float)(auVar40._0_4_ >> 0x10) - fVar220) * fVar131,
                ((float)(int)(short)uVar48 - fVar211) * fVar92);
  auVar111._8_4_ = ((float)(auVar72._8_4_ >> 0x10) - fVar222) * fVar143;
  auVar111._12_4_ = ((float)(auVar73._12_4_ >> 0x10) - fVar154) * fVar152;
  uVar48 = *(ulong *)(prim + uVar54 * 0x17 + 6);
  uVar91 = (undefined2)(uVar48 >> 0x30);
  auVar77._8_4_ = 0;
  auVar77._0_8_ = uVar48;
  auVar77._12_2_ = uVar91;
  auVar77._14_2_ = uVar91;
  uVar91 = (undefined2)(uVar48 >> 0x20);
  auVar76._12_4_ = auVar77._12_4_;
  auVar76._8_2_ = 0;
  auVar76._0_8_ = uVar48;
  auVar76._10_2_ = uVar91;
  auVar75._10_6_ = auVar76._10_6_;
  auVar75._8_2_ = uVar91;
  auVar75._0_8_ = uVar48;
  uVar91 = (undefined2)(uVar48 >> 0x10);
  auVar41._4_8_ = auVar75._8_8_;
  auVar41._2_2_ = uVar91;
  auVar41._0_2_ = uVar91;
  auVar78._0_4_ = ((float)(int)(short)uVar48 - fVar211) * fVar92;
  auVar78._4_4_ = ((float)(auVar41._0_4_ >> 0x10) - fVar220) * fVar131;
  auVar78._8_4_ = ((float)(auVar75._8_4_ >> 0x10) - fVar222) * fVar143;
  auVar78._12_4_ = ((float)(auVar76._12_4_ >> 0x10) - fVar154) * fVar152;
  auVar173._8_4_ = auVar156._8_4_;
  auVar173._0_8_ = auVar156._0_8_;
  auVar173._12_4_ = auVar156._12_4_;
  auVar174 = minps(auVar173,auVar204);
  auVar148._8_4_ = auVar134._8_4_;
  auVar148._0_8_ = auVar134._0_8_;
  auVar148._12_4_ = auVar134._12_4_;
  auVar64 = minps(auVar148,auVar225);
  auVar174 = maxps(auVar174,auVar64);
  auVar149._8_4_ = auVar111._8_4_;
  auVar149._0_8_ = auVar111._0_8_;
  auVar149._12_4_ = auVar111._12_4_;
  auVar64 = minps(auVar149,auVar78);
  auVar212._4_4_ = uVar53;
  auVar212._0_4_ = uVar53;
  auVar212._8_4_ = uVar53;
  auVar212._12_4_ = uVar53;
  auVar64 = maxps(auVar64,auVar212);
  auVar64 = maxps(auVar174,auVar64);
  fVar153 = auVar64._0_4_ * 0.99999964;
  fVar63 = auVar64._4_4_ * 0.99999964;
  fVar92 = auVar64._8_4_ * 0.99999964;
  fVar94 = auVar64._12_4_ * 0.99999964;
  auVar174 = maxps(auVar156,auVar204);
  auVar64 = maxps(auVar134,auVar225);
  auVar174 = minps(auVar174,auVar64);
  auVar64 = maxps(auVar111,auVar78);
  uVar53 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar79._4_4_ = uVar53;
  auVar79._0_4_ = uVar53;
  auVar79._8_4_ = uVar53;
  auVar79._12_4_ = uVar53;
  auVar64 = minps(auVar64,auVar79);
  auVar64 = minps(auVar174,auVar64);
  auVar112._0_4_ = -(uint)(PVar5 != (Primitive)0x0 && fVar153 <= auVar64._0_4_ * 1.0000004);
  auVar112._4_4_ = -(uint)(1 < (byte)PVar5 && fVar63 <= auVar64._4_4_ * 1.0000004);
  auVar112._8_4_ = -(uint)(2 < (byte)PVar5 && fVar92 <= auVar64._8_4_ * 1.0000004);
  auVar112._12_4_ = -(uint)(3 < (byte)PVar5 && fVar94 <= auVar64._12_4_ * 1.0000004);
  uVar53 = movmskps((int)ray,auVar112);
  local_3f0 = CONCAT44((int)((ulong)ray >> 0x20),uVar53);
  local_4b8 = pre->ray_space + k;
  local_3f8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  bVar14 = (int)mm_lookupmask_ps._240_4_ < 0;
  bVar15 = (int)mm_lookupmask_ps._244_4_ < 0;
  bVar16 = (int)mm_lookupmask_ps._248_4_ < 0;
LAB_003115c0:
  pLVar52 = local_4b8;
  if (local_3f0 == 0) {
LAB_00313715:
    return local_3f0 != 0;
  }
  lVar49 = 0;
  if (local_3f0 != 0) {
    for (; (local_3f0 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  uVar58 = *(uint *)(prim + 2);
  uVar59 = *(uint *)(prim + lVar49 * 4 + 6);
  uVar48 = (ulong)uVar59;
  pGVar7 = (context->scene->geometries).items[uVar58].ptr;
  uVar54 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * uVar48);
  p_Var50 = pGVar7[1].intersectionFilterN;
  pvVar8 = pGVar7[2].userPtr;
  _Var9 = pGVar7[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  pfVar3 = (float *)(_Var9 + uVar54 * (long)pvVar8);
  fVar98 = *pfVar3;
  fVar131 = pfVar3[1];
  fVar132 = pfVar3[2];
  fVar133 = pfVar3[3];
  puVar4 = (undefined8 *)(_Var9 + (uVar54 + 1) * (long)pvVar8);
  uVar24 = *puVar4;
  uVar25 = puVar4[1];
  pfVar3 = (float *)(_Var9 + (uVar54 + 2) * (long)pvVar8);
  fVar143 = *pfVar3;
  fVar144 = pfVar3[1];
  fVar147 = pfVar3[2];
  fVar152 = pfVar3[3];
  pfVar3 = (float *)(_Var9 + (long)pvVar8 * (uVar54 + 3));
  fVar170 = *pfVar3;
  fVar184 = pfVar3[1];
  fVar186 = pfVar3[2];
  fVar224 = pfVar3[3];
  lVar49 = *(long *)&pGVar7[1].time_range.upper;
  pauVar1 = (undefined1 (*) [12])(lVar49 + (long)p_Var50 * uVar54);
  auVar27 = *pauVar1;
  fVar211 = *(float *)pauVar1[1];
  pfVar3 = (float *)(lVar49 + (long)p_Var50 * (uVar54 + 1));
  fVar220 = *pfVar3;
  fVar222 = pfVar3[1];
  fVar154 = pfVar3[2];
  fVar167 = pfVar3[3];
  uVar56 = local_3f0 - 1 & local_3f0;
  pfVar3 = (float *)(lVar49 + (long)p_Var50 * (uVar54 + 2));
  fVar168 = *pfVar3;
  fVar189 = pfVar3[1];
  fVar206 = pfVar3[2];
  fVar208 = pfVar3[3];
  lVar10 = 0;
  if (uVar56 != 0) {
    for (; (uVar56 >> lVar10 & 1) == 0; lVar10 = lVar10 + 1) {
    }
  }
  pfVar3 = (float *)(lVar49 + (long)p_Var50 * (uVar54 + 3));
  fVar234 = *pfVar3;
  fVar235 = pfVar3[1];
  fVar236 = pfVar3[2];
  fVar246 = pfVar3[3];
  if (((uVar56 != 0) && (uVar54 = uVar56 - 1 & uVar56, uVar54 != 0)) && (lVar49 = 0, uVar54 != 0)) {
    for (; (uVar54 >> lVar49 & 1) == 0; lVar49 = lVar49 + 1) {
    }
  }
  fVar248 = *(float *)(ray + k * 4);
  fVar251 = *(float *)(ray + k * 4 + 0x10);
  fVar259 = *(float *)(ray + k * 4 + 0x20);
  fVar287 = (fVar168 * 0.5 + fVar234 * 0.0 + fVar220 * 0.0) - *(float *)*pauVar1 * 0.5;
  fVar297 = (fVar189 * 0.5 + fVar235 * 0.0 + fVar222 * 0.0) - *(float *)(*pauVar1 + 4) * 0.5;
  fVar301 = (fVar206 * 0.5 + fVar236 * 0.0 + fVar154 * 0.0) - *(float *)(*pauVar1 + 8) * 0.5;
  fVar305 = (fVar208 * 0.5 + fVar246 * 0.0 + fVar167 * 0.0) - fVar211 * 0.5;
  p01.field_0.i[0] = (int)uVar24;
  p01.field_0.i[1] = (int)((ulong)uVar24 >> 0x20);
  p01.field_0.i[2] = (int)uVar25;
  p01.field_0.i[3] = (int)((ulong)uVar25 >> 0x20);
  fVar316 = (fVar143 * 0.5 + fVar170 * 0.0 + p01.field_0.v[0] * 0.0) - fVar98 * 0.5;
  fVar298 = (fVar144 * 0.5 + fVar184 * 0.0 + p01.field_0.v[1] * 0.0) - fVar131 * 0.5;
  fVar302 = (fVar147 * 0.5 + fVar186 * 0.0 + p01.field_0.v[2] * 0.0) - fVar132 * 0.5;
  fVar306 = (fVar152 * 0.5 + fVar224 * 0.0 + p01.field_0.v[3] * 0.0) - fVar133 * 0.5;
  fVar308 = *(float *)*pauVar1 * -0.0;
  fVar318 = *(float *)(*pauVar1 + 4) * -0.0;
  fVar320 = *(float *)(*pauVar1 + 8) * -0.0;
  fVar262 = fVar168 * 0.0 + fVar234 * -0.0 + fVar220 + fVar308;
  fVar268 = fVar189 * 0.0 + fVar235 * -0.0 + fVar222 + fVar318;
  fVar275 = fVar206 * 0.0 + fVar236 * -0.0 + fVar154 + fVar320;
  fVar280 = fVar208 * 0.0 + fVar246 * -0.0 + fVar167 + fVar211 * -0.0;
  fVar308 = fVar234 * -0.0 + fVar168 + fVar220 * 0.0 + fVar308;
  fVar318 = fVar235 * -0.0 + fVar189 + fVar222 * 0.0 + fVar318;
  fVar320 = fVar236 * -0.0 + fVar206 + fVar154 * 0.0 + fVar320;
  fVar284 = fVar246 * -0.0 + fVar208 + fVar167 * 0.0 + fVar211 * -0.0;
  fVar321 = fVar143 * 0.0 + fVar170 * -0.0 + p01.field_0.v[0] + fVar98 * -0.0;
  fVar327 = fVar144 * 0.0 + fVar184 * -0.0 + p01.field_0.v[1] + fVar131 * -0.0;
  fVar330 = fVar147 * 0.0 + fVar186 * -0.0 + p01.field_0.v[2] + fVar132 * -0.0;
  fVar332 = fVar152 * 0.0 + fVar224 * -0.0 + p01.field_0.v[3] + fVar133 * -0.0;
  local_548._0_4_ = auVar27._0_4_;
  local_548._4_4_ = auVar27._4_4_;
  fStack_540 = auVar27._8_4_;
  fVar220 = (float)local_548._0_4_ * 0.0 + ((fVar234 * 0.5 + fVar168 * 0.0) - fVar220 * 0.5);
  fVar222 = (float)local_548._4_4_ * 0.0 + ((fVar235 * 0.5 + fVar189 * 0.0) - fVar222 * 0.5);
  fVar154 = fStack_540 * 0.0 + ((fVar236 * 0.5 + fVar206 * 0.0) - fVar154 * 0.5);
  fVar211 = fVar211 * 0.0 + ((fVar246 * 0.5 + fVar208 * 0.0) - fVar167 * 0.5);
  fVar167 = fVar170 * -0.0 + fVar143 + p01.field_0.v[0] * 0.0 + fVar98 * -0.0;
  fVar168 = fVar184 * -0.0 + fVar144 + p01.field_0.v[1] * 0.0 + fVar131 * -0.0;
  fVar189 = fVar186 * -0.0 + fVar147 + p01.field_0.v[2] * 0.0 + fVar132 * -0.0;
  fVar206 = fVar224 * -0.0 + fVar152 + p01.field_0.v[3] * 0.0 + fVar133 * -0.0;
  fVar98 = fVar98 * 0.0 + ((fVar170 * 0.5 + fVar143 * 0.0) - p01.field_0.v[0] * 0.5);
  fVar131 = fVar131 * 0.0 + ((fVar184 * 0.5 + fVar144 * 0.0) - p01.field_0.v[1] * 0.5);
  fVar143 = fVar132 * 0.0 + ((fVar186 * 0.5 + fVar147 * 0.0) - p01.field_0.v[2] * 0.5);
  fVar246 = fVar133 * 0.0 + ((fVar224 * 0.5 + fVar152 * 0.0) - p01.field_0.v[3] * 0.5);
  fVar309 = fVar297 * fVar321 - fVar327 * fVar287;
  fVar327 = fVar301 * fVar327 - fVar330 * fVar297;
  fVar321 = fVar287 * fVar330 - fVar321 * fVar301;
  fVar330 = fVar305 * fVar332 - fVar332 * fVar305;
  fVar208 = fVar297 * fVar316 - fVar298 * fVar287;
  fVar234 = fVar301 * fVar298 - fVar302 * fVar297;
  fVar235 = fVar287 * fVar302 - fVar316 * fVar301;
  fVar152 = fVar222 * fVar167 - fVar168 * fVar220;
  fVar184 = fVar154 * fVar168 - fVar189 * fVar222;
  fVar186 = fVar220 * fVar189 - fVar167 * fVar154;
  fVar224 = fVar211 * fVar206 - fVar206 * fVar211;
  fVar132 = fVar222 * fVar98 - fVar131 * fVar220;
  fVar131 = fVar154 * fVar131 - fVar143 * fVar222;
  fVar144 = fVar220 * fVar143 - fVar98 * fVar154;
  fVar316 = fVar321 * fVar321 + fVar327 * fVar327 + fVar309 * fVar309;
  auVar174 = ZEXT416((uint)fVar316);
  auVar64 = rsqrtss(ZEXT416((uint)fVar316),auVar174);
  fVar98 = auVar64._0_4_;
  fVar298 = fVar98 * 1.5 - fVar98 * fVar98 * fVar316 * 0.5 * fVar98;
  fVar332 = fVar309 * fVar208 + fVar321 * fVar235 + fVar327 * fVar234;
  fVar133 = fVar330 * fVar298;
  auVar64 = rcpss(auVar174,auVar174);
  fVar167 = (2.0 - fVar316 * auVar64._0_4_) * auVar64._0_4_;
  fVar236 = fVar186 * fVar186 + fVar184 * fVar184 + fVar152 * fVar152;
  auVar64 = ZEXT416((uint)fVar236);
  auVar174 = rsqrtss(ZEXT416((uint)fVar236),auVar64);
  fVar98 = auVar174._0_4_;
  fVar170 = fVar98 * 1.5 - fVar98 * fVar98 * fVar236 * 0.5 * fVar98;
  fVar302 = fVar152 * fVar132 + fVar186 * fVar144 + fVar184 * fVar131;
  fVar147 = fVar224 * fVar170;
  auVar64 = rcpss(auVar64,auVar64);
  fVar143 = (2.0 - fVar236 * auVar64._0_4_) * auVar64._0_4_;
  local_3a8 = fVar280 * fVar327 * fVar298;
  fStack_3a4 = fVar280 * fVar321 * fVar298;
  fStack_3a0 = fVar280 * fVar309 * fVar298;
  fStack_39c = fVar280 * fVar133;
  local_3b8 = fVar262 - local_3a8;
  fStack_3b4 = fVar268 - fStack_3a4;
  fStack_3b0 = fVar275 - fStack_3a0;
  fStack_3ac = fVar280 - fStack_39c;
  fVar234 = fVar280 * fVar167 * (fVar316 * fVar234 - fVar332 * fVar327) * fVar298 +
            fVar305 * fVar327 * fVar298;
  fVar327 = fVar280 * fVar167 * (fVar316 * fVar235 - fVar332 * fVar321) * fVar298 +
            fVar305 * fVar321 * fVar298;
  fVar321 = fVar280 * fVar167 * (fVar316 * fVar208 - fVar332 * fVar309) * fVar298 +
            fVar305 * fVar309 * fVar298;
  local_3a8 = local_3a8 + fVar262;
  fStack_3a4 = fStack_3a4 + fVar268;
  fStack_3a0 = fStack_3a0 + fVar275;
  fStack_39c = fStack_39c + fVar280;
  fVar168 = fVar284 * fVar184 * fVar170;
  fVar189 = fVar284 * fVar186 * fVar170;
  fVar206 = fVar284 * fVar152 * fVar170;
  local_3d8 = fVar308 - fVar168;
  fStack_3d4 = fVar318 - fVar189;
  fStack_3d0 = fVar320 - fVar206;
  fStack_3cc = fVar284 - fVar284 * fVar147;
  fVar98 = fVar284 * fVar143 * (fVar236 * fVar131 - fVar302 * fVar184) * fVar170 +
           fVar211 * fVar184 * fVar170;
  fVar131 = fVar284 * fVar143 * (fVar236 * fVar144 - fVar302 * fVar186) * fVar170 +
            fVar211 * fVar186 * fVar170;
  fVar132 = fVar284 * fVar143 * (fVar236 * fVar132 - fVar302 * fVar152) * fVar170 +
            fVar211 * fVar152 * fVar170;
  fVar168 = fVar168 + fVar308;
  fVar189 = fVar189 + fVar318;
  fVar206 = fVar206 + fVar320;
  local_3c8 = (fVar287 - fVar234) * 0.33333334 + local_3b8;
  fStack_3c4 = (fVar297 - fVar327) * 0.33333334 + fStack_3b4;
  fStack_3c0 = (fVar301 - fVar321) * 0.33333334 + fStack_3b0;
  fStack_3bc = (fVar305 -
               (fVar280 * fVar167 * (fVar316 * (fVar305 * fVar306 - fVar306 * fVar305) -
                                    fVar332 * fVar330) * fVar298 + fVar305 * fVar133)) * 0.33333334
               + fStack_3ac;
  local_3e8 = local_3d8 - (fVar220 - fVar98) * 0.33333334;
  fStack_3e4 = fStack_3d4 - (fVar222 - fVar131) * 0.33333334;
  fStack_3e0 = fStack_3d0 - (fVar154 - fVar132) * 0.33333334;
  fStack_3dc = fStack_3cc -
               (fVar211 -
               (fVar284 * fVar143 * (fVar236 * (fVar211 * fVar246 - fVar246 * fVar211) -
                                    fVar302 * fVar224) * fVar170 + fVar211 * fVar147)) * 0.33333334;
  fVar184 = fVar168 - (fVar98 + fVar220) * 0.33333334;
  fVar211 = fVar189 - (fVar131 + fVar222) * 0.33333334;
  fVar154 = fVar206 - (fVar132 + fVar154) * 0.33333334;
  fVar208 = local_3b8 - fVar248;
  fVar235 = fStack_3b4 - fVar251;
  fVar246 = fStack_3b0 - fVar259;
  fVar262 = fStack_3ac - 0.0;
  fVar98 = (local_4b8->vx).field_0.m128[0];
  fVar131 = (local_4b8->vx).field_0.m128[1];
  fVar132 = (local_4b8->vy).field_0.m128[0];
  fVar133 = (local_4b8->vy).field_0.m128[1];
  fVar143 = (local_4b8->vz).field_0.m128[0];
  fVar144 = (local_4b8->vz).field_0.m128[1];
  fVar322 = fVar208 * fVar98 + fVar235 * fVar132 + fVar246 * fVar143;
  fVar328 = fVar208 * fVar131 + fVar235 * fVar133 + fVar246 * fVar144;
  local_358._0_8_ = CONCAT44(fVar328,fVar322);
  fVar284 = local_3c8 - fVar248;
  fVar302 = fStack_3c4 - fVar251;
  fVar309 = fStack_3c0 - fVar259;
  fVar298 = fVar284 * fVar98 + fVar302 * fVar132 + fVar309 * fVar143;
  fVar306 = fVar284 * fVar131 + fVar302 * fVar133 + fVar309 * fVar144;
  auVar335._4_4_ = fVar306;
  auVar335._0_4_ = fVar298;
  fVar268 = local_3e8 - fVar248;
  fVar316 = fStack_3e4 - fVar251;
  fVar320 = fStack_3e0 - fVar259;
  fVar308 = fVar268 * fVar98 + fVar316 * fVar132 + fVar320 * fVar143;
  fVar318 = fVar268 * fVar131 + fVar316 * fVar133 + fVar320 * fVar144;
  auVar113._4_4_ = fVar318;
  auVar113._0_4_ = fVar308;
  fVar310 = local_3d8 - fVar248;
  fVar317 = fStack_3d4 - fVar251;
  fVar319 = fStack_3d0 - fVar259;
  auVar313._0_4_ = fVar310 * fVar98 + fVar317 * fVar132 + fVar319 * fVar143;
  auVar313._4_4_ = fVar310 * fVar131 + fVar317 * fVar133 + fVar319 * fVar144;
  fVar330 = local_3a8 - fVar248;
  fVar276 = fStack_3a4 - fVar251;
  fVar281 = fStack_3a0 - fVar259;
  fVar332 = fVar330 * fVar98 + fVar276 * fVar132 + fVar281 * fVar143;
  fVar277 = fVar330 * fVar131 + fVar276 * fVar133 + fVar281 * fVar144;
  fVar287 = (fVar234 + fVar287) * 0.33333334 + local_3a8;
  fVar297 = (fVar327 + fVar297) * 0.33333334 + fStack_3a4;
  fVar327 = (fVar321 + fVar301) * 0.33333334 + fStack_3a0;
  fVar186 = fVar287 - fVar248;
  fVar220 = fVar297 - fVar251;
  fVar167 = fVar327 - fVar259;
  fVar224 = fVar186 * fVar98 + fVar220 * fVar132 + fVar167 * fVar143;
  fVar222 = fVar186 * fVar131 + fVar220 * fVar133 + fVar167 * fVar144;
  auVar335._12_4_ = fVar222;
  auVar335._8_4_ = fVar224;
  fVar147 = fVar184 - fVar248;
  fVar152 = fVar211 - fVar251;
  fVar170 = fVar154 - fVar259;
  fVar234 = fVar147 * fVar98 + fVar152 * fVar132 + fVar170 * fVar143;
  fVar236 = fVar147 * fVar131 + fVar152 * fVar133 + fVar170 * fVar144;
  fVar248 = fVar168 - fVar248;
  fVar251 = fVar189 - fVar251;
  fVar259 = fVar206 - fVar259;
  fVar132 = fVar248 * fVar98 + fVar251 * fVar132 + fVar259 * fVar143;
  fVar131 = fVar248 * fVar131 + fVar251 * fVar133 + fVar259 * fVar144;
  auVar313._12_4_ = fVar131;
  auVar313._8_4_ = fVar132;
  auVar80._8_4_ = fVar332;
  auVar80._0_8_ = local_358._0_8_;
  auVar80._12_4_ = fVar277;
  auVar64 = minps(auVar80,auVar335);
  auVar113._8_4_ = fVar234;
  auVar113._12_4_ = fVar236;
  auVar174 = minps(auVar113,auVar313);
  auVar64 = minps(auVar64,auVar174);
  auVar114._4_4_ = fVar328;
  auVar114._0_4_ = fVar322;
  auVar114._8_4_ = fVar332;
  auVar114._12_4_ = fVar277;
  auVar174 = maxps(auVar114,auVar335);
  auVar135._4_4_ = fVar318;
  auVar135._0_4_ = fVar308;
  auVar135._8_4_ = fVar234;
  auVar135._12_4_ = fVar236;
  auVar136 = maxps(auVar135,auVar313);
  auVar115 = maxps(auVar174,auVar136);
  auVar17._4_8_ = auVar136._8_8_;
  auVar17._0_4_ = auVar64._4_4_;
  auVar137._0_8_ = auVar17._0_8_ << 0x20;
  auVar137._8_4_ = auVar64._8_4_;
  auVar137._12_4_ = auVar64._12_4_;
  auVar138._8_8_ = auVar64._8_8_;
  auVar138._0_8_ = auVar137._8_8_;
  auVar174 = minps(auVar64,auVar138);
  auVar18._4_8_ = auVar64._8_8_;
  auVar18._0_4_ = auVar115._4_4_;
  auVar139._0_8_ = auVar18._0_8_ << 0x20;
  auVar139._8_4_ = auVar115._8_4_;
  auVar139._12_4_ = auVar115._12_4_;
  auVar140._8_8_ = auVar115._8_8_;
  auVar140._0_8_ = auVar139._8_8_;
  auVar64 = maxps(auVar115,auVar140);
  auVar81._0_8_ = auVar174._0_8_ & 0x7fffffff7fffffff;
  auVar81._8_4_ = auVar174._8_4_ & 0x7fffffff;
  auVar81._12_4_ = auVar174._12_4_ & 0x7fffffff;
  auVar116._0_8_ = auVar64._0_8_ & 0x7fffffff7fffffff;
  auVar116._8_4_ = auVar64._8_4_ & 0x7fffffff;
  auVar116._12_4_ = auVar64._12_4_ & 0x7fffffff;
  auVar64 = maxps(auVar81,auVar116);
  fVar98 = auVar64._4_4_;
  if (auVar64._4_4_ <= auVar64._0_4_) {
    fVar98 = auVar64._0_4_;
  }
  fVar98 = fVar98 * 9.536743e-07;
  local_358._8_8_ = local_358._0_8_;
  local_4b8 = (LinearSpace3fa *)CONCAT44(fVar277,fVar332);
  fVar143 = local_3a8 - local_3b8;
  fVar321 = fStack_3a4 - fStack_3b4;
  fVar95 = fStack_3a0 - fStack_3b0;
  fVar252 = fVar287 - local_3c8;
  fVar260 = fVar297 - fStack_3c4;
  fVar263 = fVar327 - fStack_3c0;
  fVar144 = fVar184 - local_3e8;
  fVar93 = fVar211 - fStack_3e4;
  fVar96 = fVar154 - fStack_3e0;
  fVar288 = fVar168 - local_3d8;
  fVar299 = fVar189 - fStack_3d4;
  fVar303 = fVar206 - fStack_3d0;
  bVar55 = false;
  uVar54 = 0;
  fVar133 = *(float *)(ray + k * 4 + 0x30);
  local_548._0_4_ = 0.0;
  local_548._4_4_ = 1.0;
  fStack_540 = 0.0;
  fStack_53c = 0.0;
  local_518.lower = 0.0;
  local_518.upper = 1.0;
LAB_00311f1c:
  do {
    fVar269 = 1.0 - (float)local_548._0_4_;
    fVar278 = 1.0 - (float)local_548._0_4_;
    fVar282 = 1.0 - (float)local_548._4_4_;
    fVar285 = 1.0 - (float)local_548._4_4_;
    fVar253 = local_358._0_4_ * fVar269 + fVar332 * (float)local_548._0_4_;
    fVar261 = local_358._4_4_ * fVar278 + fVar277 * (float)local_548._0_4_;
    fVar264 = local_358._8_4_ * fVar282 + fVar332 * (float)local_548._4_4_;
    fVar266 = local_358._12_4_ * fVar285 + fVar277 * (float)local_548._4_4_;
    fVar237 = fVar298 * fVar269 + fVar224 * (float)local_548._0_4_;
    fVar247 = fVar306 * fVar278 + fVar222 * (float)local_548._0_4_;
    fVar249 = fVar298 * fVar282 + fVar224 * (float)local_548._4_4_;
    fVar250 = fVar306 * fVar285 + fVar222 * (float)local_548._4_4_;
    fVar334 = fVar308 * fVar269 + fVar234 * (float)local_548._0_4_;
    fVar337 = fVar318 * fVar278 + fVar236 * (float)local_548._0_4_;
    fVar338 = fVar308 * fVar282 + fVar234 * (float)local_548._4_4_;
    fVar339 = fVar318 * fVar285 + fVar236 * (float)local_548._4_4_;
    fVar270 = fVar269 * auVar313._0_4_ + (float)local_548._0_4_ * fVar132;
    fVar279 = fVar278 * auVar313._4_4_ + (float)local_548._0_4_ * fVar131;
    fVar283 = fVar282 * auVar313._0_4_ + (float)local_548._4_4_ * fVar132;
    fVar286 = fVar285 * auVar313._4_4_ + (float)local_548._4_4_ * fVar131;
    fVar311 = (local_518.upper - local_518.lower) * 0.11111111;
    fVar323 = (local_518.upper - local_518.lower) * 0.0 + local_518.lower;
    fVar329 = (local_518.upper - local_518.lower) * 0.33333334 + local_518.lower;
    fVar331 = (local_518.upper - local_518.lower) * 0.6666667 + local_518.lower;
    fVar333 = (local_518.upper - local_518.lower) * 1.0 + local_518.lower;
    fVar278 = 1.0 - fVar323;
    fVar282 = 1.0 - fVar329;
    fVar145 = 1.0 - fVar331;
    fVar146 = 1.0 - fVar333;
    fVar171 = fVar237 * fVar278 + fVar334 * fVar323;
    fVar185 = fVar237 * fVar282 + fVar334 * fVar329;
    fVar187 = fVar237 * fVar145 + fVar334 * fVar331;
    fVar188 = fVar237 * fVar146 + fVar334 * fVar333;
    fVar190 = fVar247 * fVar278 + fVar337 * fVar323;
    fVar207 = fVar247 * fVar282 + fVar337 * fVar329;
    fVar209 = fVar247 * fVar145 + fVar337 * fVar331;
    fVar210 = fVar247 * fVar146 + fVar337 * fVar333;
    fVar269 = (fVar253 * fVar278 + fVar237 * fVar323) * fVar278 + fVar323 * fVar171;
    fVar285 = (fVar253 * fVar282 + fVar237 * fVar329) * fVar282 + fVar329 * fVar185;
    fVar169 = (fVar253 * fVar145 + fVar237 * fVar331) * fVar145 + fVar331 * fVar187;
    fVar237 = (fVar253 * fVar146 + fVar237 * fVar333) * fVar146 + fVar333 * fVar188;
    fVar253 = (fVar261 * fVar278 + fVar247 * fVar323) * fVar278 + fVar323 * fVar190;
    fVar221 = (fVar261 * fVar282 + fVar247 * fVar329) * fVar282 + fVar329 * fVar207;
    fVar223 = (fVar261 * fVar145 + fVar247 * fVar331) * fVar145 + fVar331 * fVar209;
    fVar261 = (fVar261 * fVar146 + fVar247 * fVar333) * fVar146 + fVar333 * fVar210;
    fVar171 = fVar171 * fVar278 + (fVar334 * fVar278 + fVar270 * fVar323) * fVar323;
    fVar185 = fVar185 * fVar282 + (fVar334 * fVar282 + fVar270 * fVar329) * fVar329;
    fVar247 = fVar187 * fVar145 + (fVar334 * fVar145 + fVar270 * fVar331) * fVar331;
    fVar188 = fVar188 * fVar146 + (fVar334 * fVar146 + fVar270 * fVar333) * fVar333;
    fVar190 = fVar190 * fVar278 + (fVar337 * fVar278 + fVar279 * fVar323) * fVar323;
    fVar207 = fVar207 * fVar282 + (fVar337 * fVar282 + fVar279 * fVar329) * fVar329;
    fVar209 = fVar209 * fVar145 + (fVar337 * fVar145 + fVar279 * fVar331) * fVar331;
    fVar210 = fVar210 * fVar146 + (fVar337 * fVar146 + fVar279 * fVar333) * fVar333;
    local_398 = fVar278 * fVar269 + fVar323 * fVar171;
    fStack_394 = fVar282 * fVar285 + fVar329 * fVar185;
    fStack_390 = fVar145 * fVar169 + fVar331 * fVar247;
    fStack_38c = fVar146 * fVar237 + fVar333 * fVar188;
    fVar289 = fVar278 * fVar253 + fVar323 * fVar190;
    fVar300 = fVar282 * fVar221 + fVar329 * fVar207;
    fVar304 = fVar145 * fVar223 + fVar331 * fVar209;
    fVar307 = fVar146 * fVar261 + fVar333 * fVar210;
    fVar187 = (fVar185 - fVar285) * 3.0 * fVar311;
    fVar247 = (fVar247 - fVar169) * 3.0 * fVar311;
    fVar237 = (fVar188 - fVar237) * 3.0 * fVar311;
    fVar188 = (fVar207 - fVar221) * 3.0 * fVar311;
    fVar207 = (fVar209 - fVar223) * 3.0 * fVar311;
    fVar209 = (fVar210 - fVar261) * 3.0 * fVar311;
    local_368._4_4_ = fStack_390;
    local_368._0_4_ = fStack_394;
    local_368._8_4_ = fStack_38c;
    local_368._12_4_ = 0;
    local_378 = local_398 + (fVar171 - fVar269) * 3.0 * fVar311;
    fStack_374 = fStack_394 + fVar187;
    fStack_370 = fStack_390 + fVar247;
    fStack_36c = fStack_38c + fVar237;
    fVar269 = fVar289 + (fVar190 - fVar253) * 3.0 * fVar311;
    fVar285 = fVar300 + fVar188;
    fVar169 = fVar304 + fVar207;
    fVar185 = fVar307 + fVar209;
    local_388._0_4_ = fStack_394 - fVar187;
    local_388._4_4_ = fStack_390 - fVar247;
    local_388._8_4_ = fStack_38c - fVar237;
    local_388._12_4_ = 0;
    local_528._0_4_ = fVar300 - fVar188;
    local_528._4_4_ = fVar304 - fVar207;
    fStack_520 = fVar307 - fVar209;
    fStack_51c = 0.0;
    fVar247 = fVar249 * fVar278 + fVar338 * fVar323;
    fVar188 = fVar249 * fVar282 + fVar338 * fVar329;
    fVar190 = fVar249 * fVar145 + fVar338 * fVar331;
    fVar207 = fVar249 * fVar146 + fVar338 * fVar333;
    fVar209 = fVar250 * fVar278 + fVar339 * fVar323;
    fVar210 = fVar250 * fVar282 + fVar339 * fVar329;
    fVar253 = fVar250 * fVar145 + fVar339 * fVar331;
    fVar221 = fVar250 * fVar146 + fVar339 * fVar333;
    fVar171 = (fVar264 * fVar278 + fVar249 * fVar323) * fVar278 + fVar323 * fVar247;
    fVar237 = (fVar264 * fVar282 + fVar249 * fVar329) * fVar282 + fVar329 * fVar188;
    fVar187 = (fVar264 * fVar145 + fVar249 * fVar331) * fVar145 + fVar331 * fVar190;
    fVar223 = (fVar264 * fVar146 + fVar249 * fVar333) * fVar146 + fVar333 * fVar207;
    fVar334 = (fVar266 * fVar278 + fVar250 * fVar323) * fVar278 + fVar323 * fVar209;
    fVar337 = (fVar266 * fVar282 + fVar250 * fVar329) * fVar282 + fVar329 * fVar210;
    fVar265 = (fVar266 * fVar145 + fVar250 * fVar331) * fVar145 + fVar331 * fVar253;
    fVar267 = (fVar266 * fVar146 + fVar250 * fVar333) * fVar146 + fVar333 * fVar221;
    fVar261 = fVar247 * fVar278 + (fVar338 * fVar278 + fVar283 * fVar323) * fVar323;
    fVar249 = fVar188 * fVar282 + (fVar338 * fVar282 + fVar283 * fVar329) * fVar329;
    fVar250 = fVar190 * fVar145 + (fVar338 * fVar145 + fVar283 * fVar331) * fVar331;
    fVar264 = fVar207 * fVar146 + (fVar338 * fVar146 + fVar283 * fVar333) * fVar333;
    fVar279 = fVar209 * fVar278 + (fVar339 * fVar278 + fVar286 * fVar323) * fVar323;
    fVar266 = fVar210 * fVar282 + (fVar339 * fVar282 + fVar286 * fVar329) * fVar329;
    fVar270 = fVar253 * fVar145 + (fVar339 * fVar145 + fVar286 * fVar331) * fVar331;
    fVar283 = fVar221 * fVar146 + (fVar339 * fVar146 + fVar286 * fVar333) * fVar333;
    fVar209 = fVar278 * fVar171 + fVar323 * fVar261;
    fVar210 = fVar282 * fVar237 + fVar329 * fVar249;
    fVar253 = fVar145 * fVar187 + fVar331 * fVar250;
    fVar221 = fVar146 * fVar223 + fVar333 * fVar264;
    fVar247 = fVar278 * fVar334 + fVar323 * fVar279;
    fVar188 = fVar282 * fVar337 + fVar329 * fVar266;
    fVar190 = fVar145 * fVar265 + fVar331 * fVar270;
    fVar207 = fVar146 * fVar267 + fVar333 * fVar283;
    fVar278 = (fVar249 - fVar237) * 3.0 * fVar311;
    fVar145 = (fVar250 - fVar187) * 3.0 * fVar311;
    fVar237 = (fVar264 - fVar223) * 3.0 * fVar311;
    fVar264 = (fVar266 - fVar337) * 3.0 * fVar311;
    fVar266 = (fVar270 - fVar265) * 3.0 * fVar311;
    fVar270 = (fVar283 - fVar267) * 3.0 * fVar311;
    fVar265 = fVar209 + (fVar261 - fVar171) * 3.0 * fVar311;
    fVar267 = fVar210 + fVar278;
    fVar286 = fVar253 + fVar145;
    fVar323 = fVar221 + fVar237;
    fVar279 = fVar247 + (fVar279 - fVar334) * 3.0 * fVar311;
    fVar283 = fVar188 + fVar264;
    fVar334 = fVar190 + fVar266;
    fVar337 = fVar207 + fVar270;
    fVar278 = fVar210 - fVar278;
    fVar145 = fVar253 - fVar145;
    fVar237 = fVar221 - fVar237;
    fVar264 = fVar188 - fVar264;
    fVar266 = fVar190 - fVar266;
    fVar270 = fVar207 - fVar270;
    fVar282 = (fVar210 - fStack_394) + (fVar209 - local_398);
    fVar146 = (fVar253 - fStack_390) + (fVar210 - fStack_394);
    fVar171 = (fVar221 - fStack_38c) + (fVar253 - fStack_390);
    fVar187 = (fVar221 - fStack_38c) + 0.0;
    fVar223 = (fVar188 - fVar300) + (fVar247 - fVar289);
    fVar261 = (fVar190 - fVar304) + (fVar188 - fVar300);
    fVar249 = (fVar207 - fVar307) + (fVar190 - fVar304);
    fVar250 = (fVar207 - fVar307) + 0.0;
    auVar213._0_8_ =
         CONCAT44(fVar300 * fVar146 - fStack_394 * fVar261,fVar289 * fVar282 - local_398 * fVar223);
    auVar213._8_4_ = fVar304 * fVar171 - fStack_390 * fVar249;
    auVar213._12_4_ = fVar307 * fVar187 - fStack_38c * fVar250;
    auVar157._0_4_ = fVar269 * fVar282 - local_378 * fVar223;
    auVar157._4_4_ = fVar285 * fVar146 - fStack_374 * fVar261;
    auVar157._8_4_ = fVar169 * fVar171 - fStack_370 * fVar249;
    auVar157._12_4_ = fVar185 * fVar187 - fStack_36c * fVar250;
    auVar175._0_8_ =
         CONCAT44((float)local_528._4_4_ * fVar146 - fVar261 * local_388._4_4_,
                  (float)local_528._0_4_ * fVar282 - fVar223 * local_388._0_4_);
    auVar175._8_4_ = fStack_520 * fVar171 - fVar249 * local_388._8_4_;
    auVar175._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
    auVar294._0_4_ = fVar282 * fVar300 - fVar223 * fStack_394;
    auVar294._4_4_ = fVar146 * fVar304 - fVar261 * fStack_390;
    auVar294._8_4_ = fVar171 * fVar307 - fVar249 * fStack_38c;
    auVar294._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
    auVar239._0_8_ =
         CONCAT44(fVar188 * fVar146 - fVar210 * fVar261,fVar247 * fVar282 - fVar209 * fVar223);
    auVar239._8_4_ = fVar190 * fVar171 - fVar253 * fVar249;
    auVar239._12_4_ = fVar207 * fVar187 - fVar221 * fVar250;
    auVar314._0_4_ = fVar279 * fVar282 - fVar265 * fVar223;
    auVar314._4_4_ = fVar283 * fVar146 - fVar267 * fVar261;
    auVar314._8_4_ = fVar334 * fVar171 - fVar286 * fVar249;
    auVar314._12_4_ = fVar337 * fVar187 - fVar323 * fVar250;
    auVar226._0_8_ =
         CONCAT44(fVar266 * fVar146 - fVar261 * fVar145,fVar264 * fVar282 - fVar223 * fVar278);
    auVar226._8_4_ = fVar270 * fVar171 - fVar249 * fVar237;
    auVar226._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
    local_408._0_4_ = fVar282 * fVar188 - fVar223 * fVar210;
    local_408._4_4_ = fVar146 * fVar190 - fVar261 * fVar253;
    local_408._8_4_ = fVar171 * fVar207 - fVar249 * fVar221;
    local_408._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
    auVar117._8_4_ = auVar213._8_4_;
    auVar117._0_8_ = auVar213._0_8_;
    auVar117._12_4_ = auVar213._12_4_;
    auVar64 = minps(auVar117,auVar157);
    auVar115 = maxps(auVar213,auVar157);
    auVar158._8_4_ = auVar175._8_4_;
    auVar158._0_8_ = auVar175._0_8_;
    auVar158._12_4_ = auVar175._12_4_;
    auVar174 = minps(auVar158,auVar294);
    auVar64 = minps(auVar64,auVar174);
    auVar174 = maxps(auVar175,auVar294);
    auVar136 = maxps(auVar115,auVar174);
    auVar159._8_4_ = auVar239._8_4_;
    auVar159._0_8_ = auVar239._0_8_;
    auVar159._12_4_ = auVar239._12_4_;
    auVar174 = minps(auVar159,auVar314);
    auVar240 = maxps(auVar239,auVar314);
    auVar176._8_4_ = auVar226._8_4_;
    auVar176._0_8_ = auVar226._0_8_;
    auVar176._12_4_ = auVar226._12_4_;
    auVar115 = minps(auVar176,local_408);
    auVar174 = minps(auVar174,auVar115);
    auVar64 = minps(auVar64,auVar174);
    auVar174 = maxps(auVar226,local_408);
    auVar174 = maxps(auVar240,auVar174);
    auVar174 = maxps(auVar136,auVar174);
    bVar57 = auVar64._4_4_ <= fVar98;
    bVar12 = auVar64._8_4_ <= fVar98;
    auVar42._4_4_ = -(uint)bVar12;
    auVar42._0_4_ = -(uint)bVar57;
    auVar42._8_4_ = -(uint)(auVar64._12_4_ <= fVar98);
    auVar42._12_4_ = 0;
    auVar121 = auVar42 << 0x20;
    bVar44 = (-fVar98 <= auVar174._0_4_ && auVar64._0_4_ <= fVar98) && bVar14;
    auVar214._0_4_ = -(uint)bVar44;
    bVar45 = (-fVar98 <= auVar174._4_4_ && bVar57) && bVar15;
    auVar214._4_4_ = -(uint)bVar45;
    bVar57 = (-fVar98 <= auVar174._8_4_ && bVar12) && bVar16;
    auVar214._8_4_ = -(uint)bVar57;
    auVar214._12_4_ = 0;
    iVar47 = movmskps((int)uVar48,auVar214);
    if (iVar47 != 0) {
      fVar282 = (fVar210 - fVar209) + (fStack_394 - local_398);
      fVar146 = (fVar253 - fVar210) + (fStack_390 - fStack_394);
      fVar171 = (fVar221 - fVar253) + (fStack_38c - fStack_390);
      fVar187 = (0.0 - fVar221) + (0.0 - fStack_38c);
      fVar223 = (fVar188 - fVar247) + (fVar300 - fVar289);
      fVar261 = (fVar190 - fVar188) + (fVar304 - fVar300);
      fVar249 = (fVar207 - fVar190) + (fVar307 - fVar304);
      fVar250 = (0.0 - fVar207) + (0.0 - fVar307);
      auVar324._0_8_ =
           CONCAT44(fVar300 * fVar146 - fStack_394 * fVar261,fVar289 * fVar282 - local_398 * fVar223
                   );
      auVar324._8_4_ = fVar304 * fVar171 - fStack_390 * fVar249;
      auVar324._12_4_ = fVar307 * fVar187 - fStack_38c * fVar250;
      auVar160._0_4_ = fVar269 * fVar282 - local_378 * fVar223;
      auVar160._4_4_ = fVar285 * fVar146 - fStack_374 * fVar261;
      auVar160._8_4_ = fVar169 * fVar171 - fStack_370 * fVar249;
      auVar160._12_4_ = fVar185 * fVar187 - fStack_36c * fVar250;
      auVar227._0_8_ =
           CONCAT44((float)local_528._4_4_ * fVar146 - local_388._4_4_ * fVar261,
                    (float)local_528._0_4_ * fVar282 - local_388._0_4_ * fVar223);
      auVar227._8_4_ = fStack_520 * fVar171 - local_388._8_4_ * fVar249;
      auVar227._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
      auVar177._0_4_ = fVar300 * fVar282 - fStack_394 * fVar223;
      auVar177._4_4_ = fVar304 * fVar146 - fStack_390 * fVar261;
      auVar177._8_4_ = fVar307 * fVar171 - fStack_38c * fVar249;
      auVar177._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
      auVar141._0_8_ =
           CONCAT44(fVar188 * fVar146 - fVar210 * fVar261,fVar247 * fVar282 - fVar209 * fVar223);
      auVar141._8_4_ = fVar190 * fVar171 - fVar253 * fVar249;
      auVar141._12_4_ = fVar207 * fVar187 - fVar221 * fVar250;
      auVar254._0_4_ = fVar279 * fVar282 - fVar265 * fVar223;
      auVar254._4_4_ = fVar283 * fVar146 - fVar267 * fVar261;
      auVar254._8_4_ = fVar334 * fVar171 - fVar286 * fVar249;
      auVar254._12_4_ = fVar337 * fVar187 - fVar323 * fVar250;
      auVar295._0_8_ =
           CONCAT44(fVar266 * fVar146 - fVar145 * fVar261,fVar264 * fVar282 - fVar278 * fVar223);
      auVar295._8_4_ = fVar270 * fVar171 - fVar237 * fVar249;
      auVar295._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
      local_408._0_4_ = fVar282 * fVar188 - fVar223 * fVar210;
      local_408._4_4_ = fVar146 * fVar190 - fVar261 * fVar253;
      local_408._8_4_ = fVar171 * fVar207 - fVar249 * fVar221;
      local_408._12_4_ = fVar187 * 0.0 - fVar250 * 0.0;
      auVar118._8_4_ = auVar324._8_4_;
      auVar118._0_8_ = auVar324._0_8_;
      auVar118._12_4_ = auVar324._12_4_;
      auVar64 = minps(auVar118,auVar160);
      auVar115 = maxps(auVar324,auVar160);
      auVar161._8_4_ = auVar227._8_4_;
      auVar161._0_8_ = auVar227._0_8_;
      auVar161._12_4_ = auVar227._12_4_;
      auVar174 = minps(auVar161,auVar177);
      auVar64 = minps(auVar64,auVar174);
      auVar174 = maxps(auVar227,auVar177);
      auVar240 = maxps(auVar115,auVar174);
      auVar162._8_4_ = auVar141._8_4_;
      auVar162._0_8_ = auVar141._0_8_;
      auVar162._12_4_ = auVar141._12_4_;
      auVar115 = minps(auVar162,auVar254);
      auVar174 = maxps(auVar141,auVar254);
      auVar178._8_4_ = auVar295._8_4_;
      auVar178._0_8_ = auVar295._0_8_;
      auVar178._12_4_ = auVar295._12_4_;
      auVar136 = minps(auVar178,local_408);
      auVar115 = minps(auVar115,auVar136);
      auVar64 = minps(auVar64,auVar115);
      auVar115 = maxps(auVar295,local_408);
      auVar174 = maxps(auVar174,auVar115);
      auVar174 = maxps(auVar240,auVar174);
      bVar12 = auVar64._4_4_ <= fVar98;
      bVar13 = auVar64._8_4_ <= fVar98;
      auVar43._4_4_ = -(uint)bVar13;
      auVar43._0_4_ = -(uint)bVar12;
      auVar43._8_4_ = -(uint)(auVar64._12_4_ <= fVar98);
      auVar43._12_4_ = 0;
      auVar121 = auVar43 << 0x20;
      auVar325._0_4_ = -(uint)((-fVar98 <= auVar174._0_4_ && auVar64._0_4_ <= fVar98) && bVar44);
      auVar325._4_4_ = -(uint)((-fVar98 <= auVar174._4_4_ && bVar12) && bVar45);
      auVar325._8_4_ = -(uint)((-fVar98 <= auVar174._8_4_ && bVar13) && bVar57);
      auVar325._12_4_ = 0;
      uVar61 = movmskps(iVar47,auVar325);
      if (uVar61 != 0) {
        mask_stack[uVar54] = uVar61 & 0xff;
        cu_stack[uVar54] = local_518;
        cv_stack[uVar54].lower = (float)local_548._0_4_;
        cv_stack[uVar54].upper = (float)local_548._4_4_;
        uVar54 = (ulong)((int)uVar54 + 1);
        local_408 = _local_548;
      }
    }
LAB_00312583:
    auVar64 = _local_528;
    if ((int)uVar54 == 0) {
      if (bVar55) goto LAB_00313715;
      fVar98 = *(float *)(ray + k * 4 + 0x80);
      auVar129._4_4_ = -(uint)(fVar63 <= fVar98);
      auVar129._0_4_ = -(uint)(fVar153 <= fVar98);
      auVar129._8_4_ = -(uint)(fVar92 <= fVar98);
      auVar129._12_4_ = -(uint)(fVar94 <= fVar98);
      uVar58 = movmskps((int)ray,auVar129);
      local_3f0 = (ulong)((uint)uVar56 & uVar58);
      goto LAB_003115c0;
    }
    uVar62 = (int)uVar54 - 1;
    uVar48 = (ulong)uVar62;
    uVar61 = mask_stack[uVar48];
    local_548._0_4_ = cv_stack[uVar48].lower;
    local_548._4_4_ = cv_stack[uVar48].upper;
    fStack_540 = 0.0;
    fStack_53c = 0.0;
    uVar11 = 0;
    if (uVar61 != 0) {
      for (; (uVar61 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar61 = uVar61 - 1 & uVar61;
    mask_stack[uVar48] = uVar61;
    if (uVar61 == 0) {
      uVar54 = (ulong)uVar62;
    }
    fVar282 = (float)(uVar11 + 1) * 0.33333334;
    fVar285 = local_408._4_4_ * 0.0;
    fVar145 = auVar121._4_4_ * 0.0;
    fVar269 = cu_stack[uVar48].lower;
    fVar278 = cu_stack[uVar48].upper;
    local_518.lower =
         fVar269 * (1.0 - (float)uVar11 * 0.33333334) + fVar278 * (float)uVar11 * 0.33333334;
    local_518.upper = fVar269 * (1.0 - fVar282) + fVar278 * fVar282;
    fVar282 = fVar269 * (0.0 - fVar285) + fVar278 * fVar285;
    fVar278 = fVar269 * (0.0 - fVar145) + fVar278 * fVar145;
    fVar269 = local_518.upper - local_518.lower;
    if (fVar269 < 0.16666667) {
      fVar247 = 1.0 - (float)local_548._0_4_;
      fVar188 = 1.0 - (float)local_548._0_4_;
      fVar190 = 1.0 - (float)local_548._4_4_;
      fVar207 = 1.0 - (float)local_548._4_4_;
      fVar237 = local_358._0_4_ * fVar247 + fVar332 * (float)local_548._0_4_;
      fVar185 = local_358._4_4_ * fVar188 + fVar277 * (float)local_548._0_4_;
      fVar285 = local_358._8_4_ * fVar190 + fVar332 * (float)local_548._4_4_;
      fVar145 = local_358._12_4_ * fVar207 + fVar277 * (float)local_548._4_4_;
      fVar146 = fVar298 * fVar247 + fVar224 * (float)local_548._0_4_;
      fVar169 = fVar306 * fVar188 + fVar222 * (float)local_548._0_4_;
      fVar171 = fVar298 * fVar190 + fVar224 * (float)local_548._4_4_;
      fVar187 = fVar306 * fVar207 + fVar222 * (float)local_548._4_4_;
      fVar264 = fVar308 * fVar247 + fVar234 * (float)local_548._0_4_;
      fVar270 = fVar318 * fVar188 + fVar236 * (float)local_548._0_4_;
      fVar283 = fVar308 * fVar190 + fVar234 * (float)local_548._4_4_;
      fVar337 = fVar318 * fVar207 + fVar236 * (float)local_548._4_4_;
      fVar253 = (fVar247 * auVar313._0_4_ + (float)local_548._0_4_ * fVar132) - fVar264;
      fVar221 = (fVar188 * auVar313._4_4_ + (float)local_548._0_4_ * fVar131) - fVar270;
      fVar249 = (fVar190 * auVar313._0_4_ + (float)local_548._4_4_ * fVar132) - fVar283;
      fVar250 = (fVar207 * auVar313._4_4_ + (float)local_548._4_4_ * fVar131) - fVar337;
      fVar247 = local_518.lower * (fVar264 - fVar146) + fVar146;
      fVar188 = local_518.lower * (fVar270 - fVar169) + fVar169;
      fVar223 = local_518.lower * (fVar283 - fVar171) + fVar171;
      fVar261 = local_518.lower * (fVar337 - fVar187) + fVar187;
      fVar266 = (fVar264 - fVar146) * local_518.upper + fVar146;
      fVar279 = (fVar270 - fVar169) * local_518.upper + fVar169;
      fVar334 = (fVar283 - fVar171) * local_518.upper + fVar171;
      fVar265 = (fVar337 - fVar187) * local_518.upper + fVar187;
      fVar190 = local_518.lower * (fVar146 - fVar237) + fVar237;
      fVar207 = local_518.lower * (fVar169 - fVar185) + fVar185;
      fVar209 = local_518.lower * (fVar171 - fVar285) + fVar285;
      fVar210 = local_518.lower * (fVar187 - fVar145) + fVar145;
      fVar190 = (fVar247 - fVar190) * local_518.lower + fVar190;
      fVar207 = (fVar188 - fVar207) * local_518.lower + fVar207;
      fVar209 = (fVar223 - fVar209) * local_518.lower + fVar209;
      fVar210 = (fVar261 - fVar210) * local_518.lower + fVar210;
      fVar247 = (((local_518.lower * fVar253 + fVar264) - fVar247) * local_518.lower + fVar247) -
                fVar190;
      fVar188 = (((local_518.lower * fVar221 + fVar270) - fVar188) * local_518.lower + fVar188) -
                fVar207;
      fVar223 = (((local_518.lower * fVar249 + fVar283) - fVar223) * local_518.lower + fVar223) -
                fVar209;
      fVar261 = (((local_518.lower * fVar250 + fVar337) - fVar261) * local_518.lower + fVar261) -
                fVar210;
      fVar190 = local_518.lower * fVar247 + fVar190;
      fVar207 = local_518.lower * fVar188 + fVar207;
      fVar209 = local_518.lower * fVar223 + fVar209;
      fVar210 = local_518.lower * fVar261 + fVar210;
      fVar237 = (fVar146 - fVar237) * local_518.upper + fVar237;
      fVar185 = (fVar169 - fVar185) * local_518.upper + fVar185;
      fVar285 = (fVar171 - fVar285) * local_518.upper + fVar285;
      fVar145 = (fVar187 - fVar145) * local_518.upper + fVar145;
      fVar237 = (fVar266 - fVar237) * local_518.upper + fVar237;
      fVar185 = (fVar279 - fVar185) * local_518.upper + fVar185;
      fVar285 = (fVar334 - fVar285) * local_518.upper + fVar285;
      fVar145 = (fVar265 - fVar145) * local_518.upper + fVar145;
      fVar146 = (((fVar253 * local_518.upper + fVar264) - fVar266) * local_518.upper + fVar266) -
                fVar237;
      fVar169 = (((fVar221 * local_518.upper + fVar270) - fVar279) * local_518.upper + fVar279) -
                fVar185;
      fVar171 = (((fVar249 * local_518.upper + fVar283) - fVar334) * local_518.upper + fVar334) -
                fVar285;
      fVar187 = (((fVar250 * local_518.upper + fVar337) - fVar265) * local_518.upper + fVar265) -
                fVar145;
      fVar237 = local_518.upper * fVar146 + fVar237;
      fVar185 = local_518.upper * fVar169 + fVar185;
      local_518.lower = local_518.upper * fVar171 + fVar285;
      local_518.upper = local_518.upper * fVar187 + fVar145;
      fVar285 = fVar269 * 0.33333334;
      fVar253 = fVar247 * (float)DAT_01f4afa0 * fVar285 + fVar190;
      fVar221 = fVar188 * DAT_01f4afa0._4_4_ * fVar285 + fVar207;
      fVar223 = fVar223 * DAT_01f4afa0._8_4_ * fVar285 + fVar209;
      fVar261 = fVar261 * DAT_01f4afa0._12_4_ * fVar285 + fVar210;
      fVar249 = fVar237 - fVar285 * fVar146 * (float)DAT_01f4afa0;
      fVar250 = fVar185 - fVar285 * fVar169 * DAT_01f4afa0._4_4_;
      fVar264 = local_518.lower - fVar285 * fVar171 * DAT_01f4afa0._8_4_;
      fVar266 = local_518.upper - fVar285 * fVar187 * DAT_01f4afa0._12_4_;
      auVar19._4_8_ = DAT_01f4afa0._8_8_;
      auVar19._0_4_ = fVar185;
      auVar228._0_8_ = auVar19._0_8_ << 0x20;
      auVar228._8_4_ = local_518.lower;
      auVar228._12_4_ = local_518.upper;
      fVar171 = (local_518.lower - fVar237) + (fVar209 - fVar190);
      fVar187 = (local_518.upper - fVar185) + (fVar210 - fVar207);
      auVar241._0_4_ = fVar250 * fVar187;
      auVar241._4_4_ = fVar250 * fVar187;
      auVar241._8_4_ = fVar266 * fVar187;
      auVar241._12_4_ = fVar266 * fVar187;
      fVar285 = fVar190 * fVar171 + fVar207 * fVar187;
      fVar145 = fVar209 * fVar171 + fVar210 * fVar187;
      fVar247 = fVar253 * fVar171 + fVar221 * fVar187;
      fVar188 = fVar223 * fVar171 + fVar261 * fVar187;
      fVar270 = fVar249 * fVar171 + auVar241._0_4_;
      auVar215._0_8_ = CONCAT44(fVar250 * fVar171 + auVar241._4_4_,fVar270);
      auVar215._8_4_ = fVar264 * fVar171 + auVar241._8_4_;
      auVar215._12_4_ = fVar266 * fVar171 + auVar241._12_4_;
      fVar169 = fVar171 * fVar237 + fVar187 * fVar185;
      fVar279 = fVar171 * local_518.lower + fVar187 * local_518.upper;
      auVar20._4_8_ = auVar241._8_8_;
      auVar20._0_4_ = fVar221 * fVar171 + fVar221 * fVar187;
      auVar242._0_8_ = auVar20._0_8_ << 0x20;
      auVar242._8_4_ = fVar188;
      auVar242._12_4_ = fVar261 * fVar171 + fVar261 * fVar187;
      fVar146 = fVar247;
      if (fVar247 <= fVar285) {
        fVar146 = fVar285;
        fVar285 = fVar247;
      }
      auVar243._8_8_ = auVar242._8_8_;
      auVar243._0_8_ = auVar243._8_8_;
      auVar82._8_4_ = auVar215._8_4_;
      auVar82._0_8_ = auVar215._0_8_;
      auVar82._12_4_ = auVar215._12_4_;
      if (fVar169 <= fVar270) {
        auVar82._0_4_ = fVar169;
      }
      if (auVar82._0_4_ <= fVar285) {
        fVar285 = auVar82._0_4_;
      }
      auVar21._4_8_ = auVar82._8_8_;
      auVar21._0_4_ = fVar171 * fVar185 + fVar187 * fVar185;
      auVar83._0_8_ = auVar21._0_8_ << 0x20;
      auVar83._8_4_ = fVar279;
      auVar83._12_4_ = fVar171 * local_518.upper + fVar187 * local_518.upper;
      if (fVar169 <= fVar270) {
        fVar169 = fVar270;
      }
      local_408._8_8_ = auVar83._8_8_;
      local_408._0_8_ = local_408._8_8_;
      if (fVar169 <= fVar146) {
        fVar169 = fVar146;
      }
      if (fVar188 <= fVar145) {
        auVar243._0_4_ = fVar145;
        fVar145 = fVar188;
      }
      auVar119._8_4_ = auVar215._8_4_;
      auVar119._0_8_ = auVar215._8_8_;
      auVar119._12_4_ = auVar215._12_4_;
      if (fVar279 <= auVar215._8_4_) {
        auVar119._0_4_ = fVar279;
      }
      if (auVar119._0_4_ <= fVar145) {
        fVar145 = auVar119._0_4_;
      }
      if (fVar279 <= auVar215._8_4_) {
        local_408._0_4_ = auVar215._8_4_;
      }
      if (local_408._0_4_ <= auVar243._0_4_) {
        local_408._0_4_ = auVar243._0_4_;
      }
      fVar146 = local_408._0_4_;
      if ((0.0001 <= fVar285) || (fVar146 <= -0.0001)) break;
      goto LAB_003128de;
    }
  } while( true );
  auVar121._0_12_ = ZEXT812(0x38d1b717);
  auVar121._12_4_ = 0;
  if ((fVar145 < 0.0001 && -0.0001 < fVar169) ||
     ((fVar285 < 0.0001 && -0.0001 < fVar169 || (fVar145 < 0.0001 && -0.0001 < fVar146)))) {
LAB_003128de:
    local_528 = (undefined1  [8])auVar228._8_8_;
    fVar187 = (float)(~-(uint)(fVar285 < 0.0) & 0x3f800000 | -(uint)(fVar285 < 0.0) & 0xbf800000);
    fVar247 = (float)(~-(uint)(fVar169 < 0.0) & 0x3f800000 | -(uint)(fVar169 < 0.0) & 0xbf800000);
    fVar171 = 0.0;
    if ((fVar187 == fVar247) && (!NAN(fVar187) && !NAN(fVar247))) {
      fVar171 = INFINITY;
    }
    fVar188 = 0.0;
    if ((fVar187 == fVar247) && (!NAN(fVar187) && !NAN(fVar247))) {
      fVar188 = -INFINITY;
    }
    fVar270 = (float)(~-(uint)(fVar145 < 0.0) & 0x3f800000 | -(uint)(fVar145 < 0.0) & 0xbf800000);
    if ((fVar187 != fVar270) || (fVar279 = fVar188, NAN(fVar187) || NAN(fVar270))) {
      if ((fVar145 != fVar285) || (NAN(fVar145) || NAN(fVar285))) {
        fVar145 = -fVar285 / (fVar145 - fVar285);
        fVar145 = (1.0 - fVar145) * 0.0 + fVar145;
        fVar279 = fVar145;
      }
      else {
        fVar145 = 0.0;
        if ((fVar285 != 0.0) || (fVar279 = 1.0, NAN(fVar285))) {
          fVar145 = INFINITY;
          fVar279 = -INFINITY;
        }
      }
      if (fVar145 <= fVar171) {
        fVar171 = fVar145;
      }
      if (fVar279 <= fVar188) {
        fVar279 = fVar188;
      }
    }
    fVar285 = *(float *)(&DAT_01f4bed4 + (ulong)(fVar146 < 0.0) * 4);
    if ((fVar247 != fVar285) || (fVar145 = fVar279, NAN(fVar247) || NAN(fVar285))) {
      if ((fVar146 != fVar169) || (NAN(fVar146) || NAN(fVar169))) {
        fVar187 = -fVar169 / (fVar146 - fVar169);
        fVar187 = (1.0 - fVar187) * 0.0 + fVar187;
        fVar145 = fVar187;
      }
      else {
        fVar187 = 0.0;
        if ((fVar169 != 0.0) || (fVar145 = 1.0, NAN(fVar169))) {
          fVar187 = INFINITY;
          fVar145 = -INFINITY;
        }
      }
      if (fVar187 <= fVar171) {
        fVar171 = fVar187;
      }
      if (fVar145 <= fVar279) {
        fVar145 = fVar279;
      }
    }
    if ((fVar270 != fVar285) || (NAN(fVar270) || NAN(fVar285))) {
      fVar171 = (float)(~-(uint)(fVar171 < 1.0) & 0x3f800000 |
                       (uint)fVar171 & -(uint)(fVar171 < 1.0));
      fVar145 = (float)(~-(uint)(fVar145 < 1.0) & (uint)fVar145 |
                       -(uint)(fVar145 < 1.0) & 0x3f800000);
    }
    auVar120._0_8_ =
         CONCAT44(~-(uint)(fVar145 < 1.0),~-(uint)(fVar171 < 0.0) & (uint)fVar171) &
         0x3f800000ffffffff;
    auVar120._8_8_ = 0;
    auVar121 = auVar120 | ZEXT416((uint)fVar145 & -(uint)(fVar145 < 1.0)) << 0x20;
    fVar285 = auVar121._4_4_;
    local_408._4_4_ = fVar285;
    local_408._0_4_ = fVar285;
    local_408._8_4_ = fVar285;
    local_408._12_4_ = fVar285;
    if (auVar121._0_4_ <= fVar285) {
      fVar145 = auVar121._0_4_ + -0.1;
      fVar169 = auVar121._8_4_ + 0.0;
      fVar171 = auVar121._12_4_ + 0.0;
      uVar61 = -(uint)(fVar285 + 0.1 < 1.0);
      fVar145 = (float)(~-(uint)(fVar145 < 0.0) & (uint)fVar145);
      fVar285 = (float)(~uVar61 & 0x3f800000 | (uint)(fVar285 + 0.1) & uVar61);
      fVar270 = 1.0 - fVar145;
      fVar279 = 1.0 - fVar145;
      fVar283 = 1.0 - fVar285;
      fVar334 = 1.0 - fVar285;
      fVar187 = fVar190 * fVar270 + fVar209 * fVar145;
      fVar247 = fVar207 * fVar279 + fVar210 * fVar145;
      fVar188 = fVar190 * fVar283 + fVar209 * fVar285;
      fVar190 = fVar207 * fVar334 + fVar210 * fVar285;
      fVar207 = fVar253 * fVar270 + fVar223 * fVar145;
      fVar210 = fVar221 * fVar279 + fVar261 * fVar145;
      fVar253 = fVar253 * fVar283 + fVar223 * fVar285;
      fVar221 = fVar221 * fVar334 + fVar261 * fVar285;
      fVar223 = fVar249 * fVar270 + fVar264 * fVar145;
      fVar261 = fVar250 * fVar279 + fVar266 * fVar145;
      fVar249 = fVar249 * fVar283 + fVar264 * fVar285;
      fVar250 = fVar250 * fVar334 + fVar266 * fVar285;
      fVar264 = fVar270 * fVar237 + local_518.lower * fVar145;
      fVar266 = fVar279 * fVar185 + local_518.upper * fVar145;
      fVar270 = fVar283 * fVar237 + auVar64._8_4_ * fVar285;
      fVar279 = fVar334 * fVar185 + auVar64._12_4_ * fVar285;
      fVar237 = (float)local_548._4_4_ * fVar169;
      fVar185 = (float)local_548._4_4_ * fVar171;
      fVar209 = (float)local_548._0_4_ * (1.0 - fVar285);
      fStack_540 = (float)local_548._0_4_ * (0.0 - fVar169);
      fStack_53c = (float)local_548._0_4_ * (0.0 - fVar171);
      local_548._0_4_ = (float)local_548._0_4_ * (1.0 - fVar145) + (float)local_548._4_4_ * fVar145;
      local_548._4_4_ = fVar209 + (float)local_548._4_4_ * fVar285;
      fStack_540 = fStack_540 + fVar237;
      fStack_53c = fStack_53c + fVar185;
      fVar209 = 1.0 / fVar269;
      auVar122._0_4_ = fVar270 - fVar264;
      auVar122._4_4_ = fVar279 - fVar266;
      auVar122._8_4_ = fVar270 - fVar270;
      auVar122._12_4_ = fVar279 - fVar279;
      auVar150._0_8_ = CONCAT44(fVar250 - fVar261,fVar249 - fVar223);
      auVar150._8_4_ = fVar249 - fVar249;
      auVar150._12_4_ = fVar250 - fVar250;
      auVar179._0_4_ = fVar253 - fVar207;
      auVar179._4_4_ = fVar221 - fVar210;
      auVar179._8_4_ = fVar253 - fVar253;
      auVar179._12_4_ = fVar221 - fVar221;
      auVar244._0_8_ = CONCAT44((fVar210 - fVar247) * 3.0,(fVar207 - fVar187) * 3.0);
      auVar244._8_4_ = (fVar253 - fVar188) * 3.0;
      auVar244._12_4_ = (fVar221 - fVar190) * 3.0;
      auVar163._0_8_ = CONCAT44((fVar261 - fVar210) * 3.0,(fVar223 - fVar207) * 3.0);
      auVar163._8_4_ = (fVar249 - fVar253) * 3.0;
      auVar163._12_4_ = (fVar250 - fVar221) * 3.0;
      auVar271._0_4_ = (fVar264 - fVar223) * 3.0;
      auVar271._4_4_ = (fVar266 - fVar261) * 3.0;
      auVar271._8_4_ = (fVar270 - fVar249) * 3.0;
      auVar271._12_4_ = (fVar279 - fVar250) * 3.0;
      auVar216._8_4_ = auVar163._8_4_;
      auVar216._0_8_ = auVar163._0_8_;
      auVar216._12_4_ = auVar163._12_4_;
      auVar174 = minps(auVar216,auVar271);
      auVar64 = maxps(auVar163,auVar271);
      auVar255._8_4_ = auVar244._8_4_;
      auVar255._0_8_ = auVar244._0_8_;
      auVar255._12_4_ = auVar244._12_4_;
      auVar136 = minps(auVar255,auVar174);
      auVar115 = maxps(auVar244,auVar64);
      auVar22._4_8_ = auVar64._8_8_;
      auVar22._0_4_ = auVar136._4_4_;
      auVar164._0_8_ = auVar22._0_8_ << 0x20;
      auVar164._8_4_ = auVar136._8_4_;
      auVar164._12_4_ = auVar136._12_4_;
      auVar165._8_8_ = auVar136._8_8_;
      auVar165._0_8_ = auVar164._8_8_;
      auVar23._4_8_ = auVar174._8_8_;
      auVar23._0_4_ = auVar115._4_4_;
      auVar217._0_8_ = auVar23._0_8_ << 0x20;
      auVar217._8_4_ = auVar115._8_4_;
      auVar217._12_4_ = auVar115._12_4_;
      auVar218._8_8_ = auVar115._8_8_;
      auVar218._0_8_ = auVar217._8_8_;
      auVar174 = minps(auVar136,auVar165);
      auVar64 = maxps(auVar115,auVar218);
      fVar283 = auVar174._0_4_ * fVar209;
      fVar334 = auVar174._4_4_ * fVar209;
      fVar337 = auVar174._8_4_ * fVar209;
      fVar265 = auVar174._12_4_ * fVar209;
      fVar210 = fVar209 * auVar64._0_4_;
      fVar221 = fVar209 * auVar64._4_4_;
      fVar261 = fVar209 * auVar64._8_4_;
      fVar209 = fVar209 * auVar64._12_4_;
      fVar270 = 1.0 / ((float)local_548._4_4_ - (float)local_548._0_4_);
      auVar84._0_8_ = CONCAT44(fVar190 - fVar247,fVar188 - fVar187);
      auVar84._8_4_ = fVar188 - fVar188;
      auVar84._12_4_ = fVar190 - fVar190;
      auVar229._8_4_ = auVar84._8_4_;
      auVar229._0_8_ = auVar84._0_8_;
      auVar229._12_4_ = auVar84._12_4_;
      auVar115 = minps(auVar229,auVar179);
      auVar64 = maxps(auVar84,auVar179);
      auVar142._8_4_ = auVar150._8_4_;
      auVar142._0_8_ = auVar150._0_8_;
      auVar142._12_4_ = auVar150._12_4_;
      auVar174 = minps(auVar142,auVar122);
      auVar115 = minps(auVar115,auVar174);
      auVar174 = maxps(auVar150,auVar122);
      auVar64 = maxps(auVar64,auVar174);
      fVar264 = auVar115._0_4_ * fVar270;
      fVar266 = auVar115._4_4_ * fVar270;
      fVar279 = fVar270 * auVar64._0_4_;
      fVar270 = fVar270 * auVar64._4_4_;
      local_528._4_4_ = local_548._0_4_;
      local_528._0_4_ = local_518.lower;
      fStack_520 = local_518.upper;
      fStack_51c = (float)local_548._4_4_;
      auVar219._4_4_ = local_548._4_4_;
      auVar219._0_4_ = local_518.upper;
      auVar219._8_4_ = fVar282;
      auVar219._12_4_ = fVar278;
      local_b8 = (local_518.lower + local_518.upper) * 0.5;
      fVar188 = ((float)local_548._0_4_ + (float)local_548._4_4_) * 0.5;
      fVar190 = (local_518.upper + fVar282) * 0.0;
      fVar207 = ((float)local_548._4_4_ + fVar278) * 0.0;
      fVar285 = (fVar298 - fVar322) * local_b8 + fVar322;
      fVar145 = (fVar306 - fVar328) * local_b8 + fVar328;
      fVar169 = (fVar224 - fVar332) * local_b8 + fVar275;
      fVar237 = (fVar222 - fVar277) * local_b8 + fVar280;
      fVar171 = (fVar308 - fVar298) * local_b8 + fVar234;
      fVar185 = (fVar318 - fVar306) * local_b8 + fVar236;
      fVar187 = (fVar234 - fVar224) * local_b8 + fVar224;
      fVar247 = (fVar236 - fVar222) * local_b8 + fVar222;
      fVar285 = (fVar171 - fVar285) * local_b8 + fVar285;
      fVar145 = (fVar185 - fVar145) * local_b8 + fVar145;
      fVar169 = (fVar187 - fVar169) * local_b8 + fVar169;
      fVar237 = (fVar247 - fVar237) * local_b8 + fVar237;
      fVar171 = ((((auVar313._0_4_ - fVar308) * local_b8 + fVar308) - fVar171) * local_b8 + fVar171)
                - fVar285;
      fVar185 = ((((auVar313._4_4_ - fVar318) * local_b8 + fVar318) - fVar185) * local_b8 + fVar185)
                - fVar145;
      fVar187 = ((((fVar132 - fVar234) * local_b8 + fVar301) - fVar187) * local_b8 + fVar187) -
                fVar169;
      fVar247 = ((((fVar131 - fVar236) * local_b8 + fVar305) - fVar247) * local_b8 + fVar247) -
                fVar237;
      fVar285 = local_b8 * fVar171 + fVar285;
      fVar145 = local_b8 * fVar185 + fVar145;
      fVar171 = fVar171 * 3.0;
      fVar185 = fVar185 * 3.0;
      fVar169 = (local_b8 * fVar187 + fVar169) - fVar285;
      fVar237 = (local_b8 * fVar247 + fVar237) - fVar145;
      fVar171 = (fVar187 * 3.0 - fVar171) * fVar188 + fVar171;
      fVar185 = (fVar247 * 3.0 - fVar185) * fVar188 + fVar185;
      auVar151._0_8_ = CONCAT44(fVar171,fVar169) ^ 0x80000000;
      auVar151._8_4_ = fVar171;
      auVar151._12_4_ = fVar171;
      fVar267 = local_518.lower - local_b8;
      fVar286 = (float)local_548._0_4_ - fVar188;
      fVar289 = local_518.upper - fVar190;
      fVar300 = (float)local_548._4_4_ - fVar207;
      fVar304 = local_518.upper - local_b8;
      fVar307 = (float)local_548._4_4_ - fVar188;
      fVar282 = fVar282 - fVar190;
      fVar278 = fVar278 - fVar207;
      fVar285 = fVar169 * fVar188 + fVar285;
      fVar145 = fVar237 * fVar188 + fVar145;
      auVar166._0_8_ = CONCAT44(fVar185,fVar237) ^ 0x8000000000000000;
      auVar166._8_4_ = -fVar185;
      auVar166._12_4_ = -fVar185;
      auVar85._0_4_ = fVar237 * fVar171 - fVar185 * fVar169;
      auVar85._4_4_ = auVar85._0_4_;
      auVar85._8_4_ = auVar85._0_4_;
      auVar85._12_4_ = auVar85._0_4_;
      auVar174 = divps(auVar166,auVar85);
      auVar64 = divps(auVar151,auVar85);
      fVar190 = auVar174._0_4_;
      fVar207 = auVar174._4_4_;
      fVar187 = auVar64._0_4_;
      fVar247 = auVar64._4_4_;
      local_b8 = local_b8 - (fVar145 * fVar187 + fVar285 * fVar190);
      fVar171 = fVar188 - (fVar145 * fVar247 + fVar285 * fVar207);
      fVar185 = fVar188 - (fVar145 * auVar64._8_4_ + fVar285 * auVar174._8_4_);
      fVar188 = fVar188 - (fVar145 * auVar64._12_4_ + fVar285 * auVar174._12_4_);
      auVar123._0_8_ = CONCAT44(fVar207 * fVar264,fVar207 * fVar283);
      auVar123._8_4_ = fVar207 * fVar334;
      auVar123._12_4_ = fVar207 * fVar266;
      auVar86._0_4_ = fVar207 * fVar210;
      auVar86._4_4_ = fVar207 * fVar279;
      auVar86._8_4_ = fVar207 * fVar221;
      auVar86._12_4_ = fVar207 * fVar270;
      auVar336._8_4_ = auVar123._8_4_;
      auVar336._0_8_ = auVar123._0_8_;
      auVar336._12_4_ = auVar123._12_4_;
      auVar136 = minps(auVar336,auVar86);
      auVar64 = maxps(auVar86,auVar123);
      auVar180._0_8_ = CONCAT44(fVar247 * fVar266,fVar247 * fVar334);
      auVar180._8_4_ = fVar247 * fVar337;
      auVar180._12_4_ = fVar247 * fVar265;
      auVar124._0_4_ = fVar247 * fVar221;
      auVar124._4_4_ = fVar247 * fVar270;
      auVar124._8_4_ = fVar247 * fVar261;
      auVar124._12_4_ = fVar247 * fVar209;
      auVar256._8_4_ = auVar180._8_4_;
      auVar256._0_8_ = auVar180._0_8_;
      auVar256._12_4_ = auVar180._12_4_;
      auVar115 = minps(auVar256,auVar124);
      auVar174 = maxps(auVar124,auVar180);
      fVar285 = 0.0 - (auVar174._0_4_ + auVar64._0_4_);
      fVar145 = 1.0 - (auVar174._4_4_ + auVar64._4_4_);
      fVar169 = 0.0 - (auVar174._8_4_ + auVar64._8_4_);
      fVar237 = 0.0 - (auVar174._12_4_ + auVar64._12_4_);
      fVar253 = 0.0 - (auVar115._0_4_ + auVar136._0_4_);
      fVar223 = 1.0 - (auVar115._4_4_ + auVar136._4_4_);
      fVar249 = 0.0 - (auVar115._8_4_ + auVar136._8_4_);
      fVar250 = 0.0 - (auVar115._12_4_ + auVar136._12_4_);
      auVar125._0_8_ = CONCAT44(fVar286 * fVar145,fVar267 * fVar285);
      auVar125._8_4_ = fVar289 * fVar169;
      auVar125._12_4_ = fVar300 * fVar237;
      auVar272._0_8_ = CONCAT44(fVar264 * fVar190,fVar283 * fVar190);
      auVar272._8_4_ = fVar334 * fVar190;
      auVar272._12_4_ = fVar266 * fVar190;
      auVar181._0_4_ = fVar190 * fVar210;
      auVar181._4_4_ = fVar190 * fVar279;
      auVar181._8_4_ = fVar190 * fVar221;
      auVar181._12_4_ = fVar190 * fVar270;
      auVar257._8_4_ = auVar272._8_4_;
      auVar257._0_8_ = auVar272._0_8_;
      auVar257._12_4_ = auVar272._12_4_;
      auVar174 = minps(auVar257,auVar181);
      auVar64 = maxps(auVar181,auVar272);
      auVar230._0_8_ = CONCAT44(fVar266 * fVar187,fVar334 * fVar187);
      auVar230._8_4_ = fVar337 * fVar187;
      auVar230._12_4_ = fVar265 * fVar187;
      auVar273._0_4_ = fVar187 * fVar221;
      auVar273._4_4_ = fVar187 * fVar270;
      auVar273._8_4_ = fVar187 * fVar261;
      auVar273._12_4_ = fVar187 * fVar209;
      auVar326._8_4_ = auVar230._8_4_;
      auVar326._0_8_ = auVar230._0_8_;
      auVar326._12_4_ = auVar230._12_4_;
      auVar136 = minps(auVar326,auVar273);
      auVar258._0_4_ = fVar267 * fVar253;
      auVar258._4_4_ = fVar286 * fVar223;
      auVar258._8_4_ = fVar289 * fVar249;
      auVar258._12_4_ = fVar300 * fVar250;
      auVar87._0_8_ = CONCAT44(fVar145 * fVar307,fVar285 * fVar304);
      auVar87._8_4_ = fVar169 * fVar282;
      auVar87._12_4_ = fVar237 * fVar278;
      auVar205._0_4_ = fVar253 * fVar304;
      auVar205._4_4_ = fVar223 * fVar307;
      auVar205._8_4_ = fVar249 * fVar282;
      auVar205._12_4_ = fVar250 * fVar278;
      auVar115 = maxps(auVar273,auVar230);
      fVar285 = 1.0 - (auVar115._0_4_ + auVar64._0_4_);
      fVar145 = 0.0 - (auVar115._4_4_ + auVar64._4_4_);
      fVar169 = 0.0 - (auVar115._8_4_ + auVar64._8_4_);
      fVar237 = 0.0 - (auVar115._12_4_ + auVar64._12_4_);
      fVar209 = 1.0 - (auVar136._0_4_ + auVar174._0_4_);
      fVar210 = 0.0 - (auVar136._4_4_ + auVar174._4_4_);
      fVar253 = 0.0 - (auVar136._8_4_ + auVar174._8_4_);
      fVar221 = 0.0 - (auVar136._12_4_ + auVar174._12_4_);
      auVar231._0_8_ = CONCAT44(fVar286 * fVar145,fVar267 * fVar285);
      auVar231._8_4_ = fVar289 * fVar169;
      auVar231._12_4_ = fVar300 * fVar237;
      auVar296._0_4_ = fVar267 * fVar209;
      auVar296._4_4_ = fVar286 * fVar210;
      auVar296._8_4_ = fVar289 * fVar253;
      auVar296._12_4_ = fVar300 * fVar221;
      auVar182._0_8_ = CONCAT44(fVar145 * fVar307,fVar285 * fVar304);
      auVar182._8_4_ = fVar169 * fVar282;
      auVar182._12_4_ = fVar237 * fVar278;
      auVar245._0_4_ = fVar209 * fVar304;
      auVar245._4_4_ = fVar210 * fVar307;
      auVar245._8_4_ = fVar253 * fVar282;
      auVar245._12_4_ = fVar221 * fVar278;
      auVar274._8_4_ = auVar231._8_4_;
      auVar274._0_8_ = auVar231._0_8_;
      auVar274._12_4_ = auVar231._12_4_;
      auVar64 = minps(auVar274,auVar296);
      auVar315._8_4_ = auVar182._8_4_;
      auVar315._0_8_ = auVar182._0_8_;
      auVar315._12_4_ = auVar182._12_4_;
      auVar174 = minps(auVar315,auVar245);
      auVar240 = minps(auVar64,auVar174);
      auVar174 = maxps(auVar296,auVar231);
      auVar64 = maxps(auVar245,auVar182);
      auVar115 = maxps(auVar64,auVar174);
      auVar232._8_4_ = auVar125._8_4_;
      auVar232._0_8_ = auVar125._0_8_;
      auVar232._12_4_ = auVar125._12_4_;
      auVar174 = minps(auVar232,auVar258);
      auVar183._8_4_ = auVar87._8_4_;
      auVar183._0_8_ = auVar87._0_8_;
      auVar183._12_4_ = auVar87._12_4_;
      auVar64 = minps(auVar183,auVar205);
      auVar174 = minps(auVar174,auVar64);
      auVar136 = maxps(auVar258,auVar125);
      auVar64 = maxps(auVar205,auVar87);
      auVar64 = maxps(auVar64,auVar136);
      auVar233._0_4_ = auVar240._4_4_ + auVar240._0_4_ + local_b8;
      auVar233._4_4_ = auVar174._4_4_ + auVar174._0_4_ + fVar171;
      auVar233._8_4_ = auVar240._8_4_ + auVar240._4_4_ + fVar185;
      auVar233._12_4_ = auVar240._12_4_ + auVar174._4_4_ + fVar188;
      fVar278 = auVar115._4_4_ + auVar115._0_4_ + local_b8;
      fVar282 = auVar64._4_4_ + auVar64._0_4_ + fVar171;
      auVar88._4_4_ = fVar282;
      auVar88._0_4_ = fVar278;
      auVar121 = maxps(_local_528,auVar233);
      auVar88._8_4_ = auVar115._8_4_ + auVar115._4_4_ + fVar185;
      auVar88._12_4_ = auVar115._12_4_ + auVar64._4_4_ + fVar188;
      auVar64 = minps(auVar88,auVar219);
      iVar47 = -(uint)(auVar64._0_4_ < auVar121._0_4_);
      iVar60 = -(uint)(auVar64._4_4_ < auVar121._4_4_);
      auVar89._4_4_ = iVar60;
      auVar89._0_4_ = iVar47;
      auVar89._8_4_ = iVar60;
      auVar89._12_4_ = iVar60;
      local_408._8_8_ = auVar89._8_8_;
      local_408._4_4_ = (float)iVar47;
      local_408._0_4_ = (float)iVar47;
      iVar47 = movmskpd((uint)(fVar146 < 0.0),local_408);
      if (iVar47 == 0) {
        bVar46 = 0;
        if ((local_518.lower < auVar233._0_4_) && (fVar278 < local_518.upper)) {
          bVar46 = -(fVar282 < (float)local_548._4_4_) & (float)local_548._0_4_ < auVar233._4_4_;
        }
        bVar46 = (3 < (uint)uVar54 || fVar269 < 0.001) | bVar46;
        uVar48 = (ulong)CONCAT31((int3)(uVar62 >> 8),bVar46);
        if (bVar46 != 1) goto LAB_00311f1c;
        lVar49 = 0xc9;
        do {
          lVar49 = lVar49 + -1;
          if (lVar49 == 0) goto LAB_00312583;
          fVar278 = 1.0 - local_b8;
          fVar146 = local_b8 * local_b8 * local_b8;
          fVar145 = local_b8 * local_b8 * 3.0 * fVar278;
          fVar269 = fVar278 * fVar278 * fVar278;
          fVar169 = local_b8 * 3.0 * fVar278 * fVar278;
          fVar278 = fVar269 * fVar322 +
                    fVar169 * fVar234 + fVar145 * fVar308 + fVar146 * auVar313._0_4_;
          fVar282 = fVar269 * fVar328 +
                    fVar169 * fVar236 + fVar145 * fVar318 + fVar146 * auVar313._4_4_;
          fVar285 = fVar269 * fVar275 + fVar169 * fVar224 + fVar145 * fVar301 + fVar146 * fVar132;
          fVar145 = fVar269 * fVar280 + fVar169 * fVar222 + fVar145 * fVar305 + fVar146 * fVar131;
          fVar146 = (fVar285 - fVar278) * fVar171;
          fVar169 = (fVar145 - fVar282) * fVar171;
          fVar269 = (fVar285 - fVar278) * fVar171 + fVar278;
          fVar285 = (fVar145 - fVar282) * fVar171 + fVar282;
          local_b8 = local_b8 - (fVar285 * fVar187 + fVar269 * fVar190);
          fVar171 = fVar171 - (fVar285 * fVar247 + fVar269 * fVar207);
          fVar145 = ABS(fVar285);
          local_408._0_8_ = CONCAT44(fVar285,fVar269) & 0x7fffffff7fffffff;
          local_408._8_4_ = ABS(fVar146 + fVar278);
          local_408._12_4_ = ABS(fVar169 + fVar282);
          auVar121._0_8_ = CONCAT44(fVar285,fVar285) & 0x7fffffff7fffffff;
          auVar121._8_4_ = (int)fVar145;
          auVar121._12_4_ = (int)fVar145;
          if (fVar145 <= ABS(fVar269)) {
            auVar121._0_4_ = ABS(fVar269);
          }
        } while (fVar98 <= auVar121._0_4_);
        if ((((0.0 <= local_b8) && (local_b8 <= 1.0)) &&
            (local_408._4_4_ = fVar171, local_408._0_4_ = fVar171, local_408._8_4_ = fVar171,
            local_408._12_4_ = fVar171, 0.0 <= fVar171)) && (fVar171 <= 1.0)) {
          fVar269 = (pLVar52->vx).field_0.m128[2];
          fVar278 = (pLVar52->vy).field_0.m128[2];
          fVar282 = (pLVar52->vz).field_0.m128[2];
          auVar126._0_4_ = fVar208 * fVar269;
          auVar126._4_4_ = fVar235 * fVar278;
          auVar126._8_4_ = fVar246 * fVar282;
          auVar126._12_4_ = fVar262 * 0.0;
          auVar127._8_8_ = auVar126._8_8_;
          auVar127._0_8_ = auVar127._8_8_;
          auVar121._4_12_ = auVar127._4_12_;
          fVar185 = 1.0 - fVar171;
          fVar237 = 1.0 - local_b8;
          fVar285 = fVar237 * fVar237 * fVar237;
          fVar145 = local_b8 * 3.0 * fVar237 * fVar237;
          fVar169 = local_b8 * local_b8 * local_b8;
          fVar146 = local_b8 * local_b8 * 3.0 * fVar237;
          auVar121._0_4_ =
               ((auVar126._8_4_ + auVar126._4_4_ + auVar126._0_4_) * fVar185 +
               (fVar281 * fVar282 + fVar276 * fVar278 + fVar330 * fVar269) * fVar171) * fVar285 +
               ((fVar309 * fVar282 + fVar302 * fVar278 + fVar284 * fVar269) * fVar185 +
               (fVar167 * fVar282 + fVar220 * fVar278 + fVar186 * fVar269) * fVar171) * fVar145 +
               ((fVar320 * fVar282 + fVar316 * fVar278 + fVar268 * fVar269) * fVar185 +
               (fVar170 * fVar282 + fVar152 * fVar278 + fVar147 * fVar269) * fVar171) * fVar146 +
               (fVar185 * (fVar319 * fVar282 + fVar317 * fVar278 + fVar310 * fVar269) +
               (fVar282 * fVar259 + fVar278 * fVar251 + fVar269 * fVar248) * fVar171) * fVar169;
          if ((fVar133 <= auVar121._0_4_) &&
             (fVar269 = *(float *)(ray + k * 4 + 0x80), auVar121._0_4_ <= fVar269)) {
            fVar187 = 1.0 - fVar171;
            fVar247 = 1.0 - fVar171;
            fVar188 = 1.0 - fVar171;
            fVar278 = local_3c8 * fVar187 + fVar287 * fVar171;
            fVar282 = fStack_3c4 * fVar247 + fVar297 * fVar171;
            fVar185 = fStack_3c0 * fVar188 + fVar327 * fVar171;
            fVar190 = local_3e8 * fVar187 + fVar184 * fVar171;
            fVar209 = fStack_3e4 * fVar247 + fVar211 * fVar171;
            fVar253 = fStack_3e0 * fVar188 + fVar154 * fVar171;
            fVar207 = fVar190 - fVar278;
            fVar210 = fVar209 - fVar282;
            fVar221 = fVar253 - fVar185;
            fVar278 = (((fVar278 - (local_3b8 * fVar187 + local_3a8 * fVar171)) * fVar237 +
                       local_b8 * fVar207) * fVar237 +
                      (fVar207 * fVar237 +
                      ((fVar187 * local_3d8 + fVar168 * fVar171) - fVar190) * local_b8) * local_b8)
                      * 3.0;
            fVar282 = (((fVar282 - (fStack_3b4 * fVar247 + fStack_3a4 * fVar171)) * fVar237 +
                       local_b8 * fVar210) * fVar237 +
                      (fVar210 * fVar237 +
                      ((fVar247 * fStack_3d4 + fVar189 * fVar171) - fVar209) * local_b8) * local_b8)
                      * 3.0;
            fVar237 = (((fVar185 - (fStack_3b0 * fVar188 + fStack_3a0 * fVar171)) * fVar237 +
                       local_b8 * fVar221) * fVar237 +
                      (fVar221 * fVar237 +
                      ((fVar188 * fStack_3d0 + fVar206 * fVar171) - fVar253) * local_b8) * local_b8)
                      * 3.0;
            pGVar7 = (context->scene->geometries).items[uVar58].ptr;
            if ((pGVar7->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
              bVar57 = false;
            }
            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                    (bVar57 = true, pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              fVar171 = fVar285 * fVar143 +
                        fVar145 * fVar252 + fVar146 * fVar144 + fVar169 * fVar288;
              fVar185 = fVar285 * fVar321 + fVar145 * fVar260 + fVar146 * fVar93 + fVar169 * fVar299
              ;
              fVar285 = fVar285 * fVar95 + fVar145 * fVar263 + fVar146 * fVar96 + fVar169 * fVar303;
              local_c8 = fVar185 * fVar278 - fVar282 * fVar171;
              local_e8 = fVar285 * fVar282 - fVar237 * fVar185;
              local_d8 = fVar171 * fVar237 - fVar278 * fVar285;
              fStack_e4 = local_e8;
              fStack_e0 = local_e8;
              fStack_dc = local_e8;
              fStack_d4 = local_d8;
              fStack_d0 = local_d8;
              fStack_cc = local_d8;
              fStack_c4 = local_c8;
              fStack_c0 = local_c8;
              fStack_bc = local_c8;
              fStack_b4 = local_b8;
              fStack_b0 = local_b8;
              fStack_ac = local_b8;
              local_a8 = local_408;
              local_98 = CONCAT44(uVar59,uVar59);
              uStack_90 = CONCAT44(uVar59,uVar59);
              local_88 = CONCAT44(uVar58,uVar58);
              uStack_80 = CONCAT44(uVar58,uVar58);
              local_78 = context->user->instID[0];
              uStack_74 = local_78;
              uStack_70 = local_78;
              uStack_6c = local_78;
              local_68 = context->user->instPrimID[0];
              uStack_64 = local_68;
              uStack_60 = local_68;
              uStack_5c = local_68;
              *(float *)(ray + k * 4 + 0x80) = auVar121._0_4_;
              local_408 = *local_3f8;
              args.valid = (int *)local_408;
              args.geometryUserPtr = pGVar7->userPtr;
              args.context = context->user;
              args.ray = (RTCRayN *)ray;
              args.hit = (RTCHitN *)&local_e8;
              args.N = 4;
              p_Var50 = pGVar7->occlusionFilterN;
              if (p_Var50 != (RTCFilterFunctionN)0x0) {
                p_Var50 = (RTCFilterFunctionN)(*p_Var50)(&args);
              }
              auVar128._0_4_ = -(uint)(local_408._0_4_ == 0);
              auVar128._4_4_ = -(uint)(local_408._4_4_ == 0);
              auVar128._8_4_ = -(uint)(local_408._8_4_ == 0);
              auVar128._12_4_ = -(uint)(local_408._12_4_ == 0);
              uVar61 = movmskps((int)p_Var50,auVar128);
              pRVar51 = (RTCRayN *)(ulong)(uVar61 ^ 0xf);
              if ((uVar61 ^ 0xf) == 0) {
                auVar128 = auVar128 ^ _DAT_01f46b70;
              }
              else {
                p_Var50 = context->args->filter;
                if ((p_Var50 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar7->field_8).field_0x2 & 0x40) != 0))))
                {
                  (*p_Var50)(&args);
                }
                auVar90._0_4_ = -(uint)(local_408._0_4_ == 0);
                auVar90._4_4_ = -(uint)(local_408._4_4_ == 0);
                auVar90._8_4_ = -(uint)(local_408._8_4_ == 0);
                auVar90._12_4_ = -(uint)(local_408._12_4_ == 0);
                auVar128 = auVar90 ^ _DAT_01f46b70;
                local_408 = ~auVar90 & _DAT_01f45a40 |
                            *(undefined1 (*) [16])(args.ray + 0x80) & auVar90;
                *(undefined1 (*) [16])(args.ray + 0x80) = local_408;
                pRVar51 = args.ray;
              }
              auVar121._0_4_ = (float)(auVar128._0_4_ << 0x1f);
              auVar121._4_4_ = auVar128._4_4_ << 0x1f;
              auVar121._8_4_ = auVar128._8_4_ << 0x1f;
              auVar121._12_4_ = auVar128._12_4_ << 0x1f;
              iVar47 = movmskps((int)pRVar51,auVar121);
              bVar57 = iVar47 != 0;
              if (!bVar57) {
                *(float *)(ray + k * 4 + 0x80) = fVar269;
              }
            }
            bVar55 = (bool)(bVar55 | bVar57);
            pLVar52 = local_4b8;
          }
        }
      }
    }
  }
  goto LAB_00312583;
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }